

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O3

MPP_RET vdpp2_params_to_reg(vdpp2_params *src_params,vdpp2_api_ctx *ctx)

{
  anon_struct_4_4_effd29bf_for_reg16 aVar1;
  anon_struct_4_3_89b91cde_for_reg2 aVar2;
  anon_struct_4_9_24a09030_for_reg3 aVar3;
  RK_U32 RVar4;
  anon_struct_4_3_30fecd47_for_reg2 aVar5;
  anon_struct_4_14_016c4910_for_reg0 aVar6;
  anon_struct_4_5_ac9e8c85_for_reg162 aVar7;
  anon_struct_4_5_051dd277_for_reg164 aVar8;
  anon_struct_4_5_e9729c4a_for_reg163 aVar9;
  anon_struct_4_5_dbe3e6bc_for_reg165 aVar10;
  anon_struct_4_5_7d0670dc_for_reg166 aVar11;
  anon_struct_4_5_ee4e9261_for_reg167 aVar12;
  anon_struct_4_6_fef62f20_for_reg2 aVar13;
  anon_struct_4_7_566f0ca7_for_reg3 aVar14;
  anon_struct_4_5_5206536f_for_reg4 aVar15;
  anon_struct_4_5_5206cbae_for_reg6 aVar16;
  anon_struct_4_5_520743ed_for_reg8 aVar17;
  anon_struct_4_6_6b67bfe3_for_reg100 aVar18;
  anon_struct_4_8_1448ed05_for_reg102 aVar19;
  anon_struct_4_7_51a04710_for_reg103 aVar20;
  anon_struct_4_7_f4a15204_for_reg104 aVar21;
  anon_struct_4_7_13dfdf50_for_reg105 aVar22;
  anon_struct_4_7_15216c04_for_reg106 aVar23;
  anon_struct_4_7_1521e444_for_reg107 aVar24;
  RK_S32 RVar25;
  anon_struct_4_6_98c00d60_for_reg110 aVar26;
  anon_struct_4_5_4e72b6e0_for_reg112 aVar27;
  anon_struct_4_5_de9b1aa1_for_reg113 aVar28;
  anon_struct_4_5_8d760384_for_reg114 aVar29;
  anon_struct_4_4_9babbec2_for_reg129 aVar30;
  anon_struct_4_5_7a7ec4dc_for_reg130 aVar31;
  anon_struct_4_7_35acda4c_for_reg131 aVar32;
  anon_struct_4_5_713fce19_for_reg134 aVar33;
  anon_struct_4_5_098cd0aa_for_reg135 aVar34;
  anon_struct_4_7_7222c14c_for_reg136 aVar35;
  anon_struct_4_6_1794af64_for_reg141 aVar36;
  anon_struct_4_6_e5dd6b84_for_reg142 aVar37;
  anon_struct_4_4_f8f30d03_for_reg143 aVar38;
  anon_struct_4_6_b61f7fc4_for_reg145 aVar39;
  anon_struct_4_6_e3c66fa4_for_reg146 aVar40;
  anon_struct_4_4_2f9cacc3_for_reg147 aVar41;
  anon_struct_4_6_54aa5024_for_reg149 aVar42;
  anon_struct_4_6_e1af73c4_for_reg150 aVar43;
  anon_struct_4_4_66464c83_for_reg151 aVar44;
  anon_struct_4_6_f3352084_for_reg153 aVar45;
  anon_struct_4_6_df9877e4_for_reg154 aVar46;
  anon_struct_4_4_9cefec43_for_reg155 aVar47;
  anon_struct_4_6_adc393a5_for_reg156 aVar48;
  anon_struct_4_5_5dea9ddc_for_reg157 aVar49;
  anon_struct_4_7_e0b31a4c_for_reg158 aVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  anon_struct_4_4_73edf603_for_reg10 aVar55;
  anon_struct_4_4_73efd703_for_reg11 aVar56;
  int iVar57;
  anon_struct_4_6_05954ecb_for_reg101 aVar58;
  anon_struct_4_3_724851b1_for_reg108 aVar59;
  anon_struct_4_5_7839e156_for_reg140 aVar60;
  anon_struct_4_5_7839e537_for_reg144 aVar61;
  anon_struct_4_5_7839e918_for_reg148 aVar62;
  anon_struct_4_5_7839ecf9_for_reg152 aVar63;
  ushort uVar64;
  float fVar65;
  anon_struct_4_3_f795cdea_for_reg13 aVar66;
  anon_struct_4_3_f795d56a_for_reg14 aVar67;
  anon_struct_4_3_f795d5aa_for_reg15 aVar68;
  anon_struct_4_3_c249374a_for_reg16 aVar69;
  anon_struct_4_3_c24937c5_for_reg17 aVar70;
  anon_struct_4_3_c2493f2a_for_reg18 aVar71;
  anon_struct_4_3_a38c4f29_for_reg19 aVar72;
  anon_struct_4_3_f3bb69ca_for_reg24 aVar73;
  anon_struct_4_3_f3bb714a_for_reg25 aVar74;
  anon_struct_4_3_f3bb718a_for_reg26 aVar75;
  anon_struct_4_3_4b775ba5_for_reg28 aVar76;
  anon_struct_4_3_4b77630a_for_reg29 aVar77;
  anon_struct_4_3_4022a749_for_reg30 aVar78;
  anon_struct_4_3_efe105aa_for_reg35 aVar79;
  anon_struct_4_3_efe10d2a_for_reg36 aVar80;
  anon_struct_4_3_efe10d6a_for_reg37 aVar81;
  anon_struct_4_3_d4a57f85_for_reg39 aVar82;
  anon_struct_4_3_d4a586ea_for_reg40 aVar83;
  anon_struct_4_3_dcb8ff69_for_reg41 aVar84;
  anon_struct_4_3_ec06a18a_for_reg46 aVar85;
  anon_struct_4_3_ec06a90a_for_reg47 aVar86;
  anon_struct_4_3_ec06a94a_for_reg48 aVar87;
  anon_struct_4_3_5dd3a365_for_reg50 aVar88;
  anon_struct_4_3_5dd3aaca_for_reg51 aVar89;
  anon_struct_4_3_794f5789_for_reg52 aVar90;
  anon_struct_4_3_e82c3d6a_for_reg57 aVar91;
  anon_struct_4_3_e82c44ea_for_reg58 aVar92;
  anon_struct_4_3_e82c452a_for_reg59 aVar93;
  anon_struct_4_3_e701c745_for_reg61 aVar94;
  anon_struct_4_3_e701ceaa_for_reg62 aVar95;
  anon_struct_4_3_15e5afa9_for_reg63 aVar96;
  anon_struct_4_3_e451d94a_for_reg68 aVar97;
  anon_struct_4_3_e451e0ca_for_reg69 aVar98;
  anon_struct_4_3_e451e10a_for_reg70 aVar99;
  anon_struct_4_3_702feb25_for_reg72 aVar100;
  anon_struct_4_3_702ff28a_for_reg73 aVar101;
  anon_struct_4_3_b27c07c9_for_reg74 aVar102;
  anon_struct_4_3_f95e0f05_for_reg83 aVar103;
  anon_struct_4_3_f95e166a_for_reg84 aVar104;
  anon_struct_4_3_4f125fe9_for_reg85 aVar105;
  anon_struct_4_3_fedd8709_for_reg160 aVar106;
  anon_struct_4_3_72b66709_for_reg133 aVar107;
  anon_struct_4_3_e077752a_for_reg79 aVar108;
  anon_struct_4_3_e0777caa_for_reg80 aVar109;
  anon_struct_4_3_e0777cea_for_reg81 aVar110;
  undefined1 auVar111 [12];
  undefined1 auVar112 [12];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  undefined1 auVar116 [12];
  undefined1 auVar117 [12];
  undefined1 auVar118 [12];
  undefined1 auVar119 [12];
  undefined1 auVar120 [12];
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  RK_U32 RVar124;
  RK_U32 RVar125;
  byte bVar126;
  anon_struct_4_17_f45c7487_for_reg1 aVar127;
  uint uVar128;
  uint uVar129;
  MPP_RET extraout_EAX;
  long lVar130;
  ushort uVar131;
  uint uVar132;
  uint uVar133;
  uint uVar134;
  anon_struct_4_5_566da832_for_reg16 aVar135;
  int iVar136;
  anon_struct_4_17_f45c7487_for_reg1 aVar137;
  uint uVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  ushort uVar142;
  anon_struct_4_5_4b644edc_for_reg137 aVar143;
  int iVar144;
  int iVar145;
  uint uVar146;
  uint uVar147;
  int iVar148;
  int iVar149;
  int iVar150;
  int iVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  int iVar157;
  int iVar158;
  uint uVar159;
  uint uVar160;
  uint uVar161;
  int iVar162;
  bool bVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar169;
  double dVar170;
  undefined1 auVar171 [16];
  float fVar172;
  double dVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar178;
  double dVar179;
  undefined1 auVar177 [16];
  float fVar180;
  float fVar181;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar195;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  ulong uVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  double dVar205;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  double dVar209;
  undefined1 auVar208 [16];
  undefined1 auVar210 [16];
  float fVar212;
  undefined1 auVar211 [16];
  RK_U8 diff2conf_lut_k [8];
  RK_S32 peaking_ctrl_ratio_N12 [7];
  RK_S32 peaking_ctrl_ratio_N01 [7];
  RK_S32 peaking_ctrl_ratio_P23 [7];
  RK_S32 peaking_ctrl_ratio_P12 [7];
  RK_S32 peaking_ctrl_ratio_P01 [7];
  RK_S32 peaking_ctrl_value_P3 [7];
  RK_S32 peaking_ctrl_value_P2 [7];
  RK_S32 peaking_ctrl_value_P1 [7];
  RK_S32 peaking_ctrl_value_N3 [7];
  RK_S32 peaking_ctrl_value_N2 [7];
  RK_S32 peaking_ctrl_value_N1 [7];
  RK_S32 peaking_ctrl_idx_N3 [7];
  RK_S32 peaking_ctrl_idx_P3 [7];
  RK_S32 peaking_ctrl_idx_N2 [7];
  RK_S32 peaking_ctrl_idx_P2 [7];
  RK_S32 peaking_ctrl_idx_N1 [7];
  RK_S32 peaking_ctrl_idx_P1 [7];
  RK_S32 peaking_ctrl_idx_N0 [7];
  int local_2dc;
  undefined8 local_2b8;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  undefined8 uStack_2a4;
  uint local_298 [8];
  uint local_278 [8];
  uint local_258 [8];
  uint local_238 [8];
  uint local_218 [8];
  uint local_1f8 [8];
  uint local_1d8 [8];
  uint local_1b8 [8];
  uint local_198 [8];
  uint local_178 [8];
  int local_158 [8];
  int local_138 [8];
  uint local_118 [8];
  uint local_f8 [8];
  uint local_d8 [8];
  uint local_b8 [8];
  int local_98 [8];
  uint local_78 [8];
  int local_58 [10];
  
  uVar129 = 0;
  memset(&ctx->reg,0,0x440);
  *(undefined1 *)&(ctx->reg).common.reg0 = 1;
  (ctx->reg).common.reg1 = (anon_struct_4_17_f45c7487_for_reg1)0x3;
  aVar127 = (anon_struct_4_17_f45c7487_for_reg1)((src_params->src_yuv_swap & 3) << 4 | 3);
  (ctx->reg).common.reg1 = aVar127;
  aVar137 = (anon_struct_4_17_f45c7487_for_reg1)0x13;
  if (src_params->src_fmt != 5) {
    aVar137 = aVar127;
  }
  (ctx->reg).common.reg1 = aVar137;
  aVar137 = (anon_struct_4_17_f45c7487_for_reg1)((src_params->dst_fmt & 3) << 8 | (uint)aVar137);
  (ctx->reg).common.reg1 = aVar137;
  aVar137 = (anon_struct_4_17_f45c7487_for_reg1)
            ((src_params->dst_yuv_swap & 3) << 0xc | (uint)aVar137);
  (ctx->reg).common.reg1 = aVar137;
  uVar132 = 0;
  if (src_params->working_mode != 3) {
    uVar132 = *(int *)&src_params->dmsr_params << 0x18;
  }
  (ctx->reg).common.reg1 = (anon_struct_4_17_f45c7487_for_reg1)(uVar132 | (uint)aVar137);
  *(byte *)&(ctx->reg).common.reg2 = (byte)src_params->working_mode & 3;
  if (((byte)vdpp2_debug & 1) == 0) {
    uVar131 = 0xfff;
    bVar126 = 0x73;
    uVar132 = 0;
    uVar147 = 0;
  }
  else {
    _mpp_log_l(4,"vdpp2","working_mode %d",(char *)0x0,(ulong)src_params->working_mode);
    uVar147 = (uint)*(ushort *)&(ctx->reg).common.reg13.field_0x2 << 0x10;
    uVar131 = SUB42((ctx->reg).common.reg4,0) | 0xfff;
    bVar126 = *(byte *)&(ctx->reg).common.reg8 | 0x73;
    uVar132 = (uint)(ctx->reg).common.reg14 & 0xffff0800;
    uVar129 = (uint)(ctx->reg).common.reg15 & 0xffff0800;
  }
  *(ushort *)&(ctx->reg).common.reg4 = uVar131;
  *(byte *)&(ctx->reg).common.reg8 = bVar126;
  uVar128 = src_params->src_width & 0xf;
  uVar146 = 0x10 - uVar128;
  if (uVar128 == 0) {
    uVar146 = 0;
  }
  uVar133 = src_params->src_height & 7;
  uVar128 = 8 - uVar133;
  if (uVar133 == 0) {
    uVar128 = 0;
  }
  uVar134 = src_params->dst_width & 0xf;
  uVar133 = 0x10 - uVar134;
  if (uVar134 == 0) {
    uVar133 = 0;
  }
  *(short *)&(ctx->reg).common.reg12 = (short)(src_params->src_width_vir >> 2);
  uVar134 = src_params->dst_width_vir >> 2 & 0xffff;
  (ctx->reg).common.reg13 = (anon_struct_4_2_b89f876b_for_reg13)(uVar147 | uVar134);
  uVar147 = (uVar146 & 0xf) << 0xc | (uVar146 + src_params->src_width) - 1 & 0x7ff;
  (ctx->reg).common.reg14 = (anon_struct_4_6_2c2caa47_for_reg14)(uVar147 | uVar132);
  (ctx->reg).common.reg14 =
       (anon_struct_4_6_2c2caa47_for_reg14)
       ((uVar128 & 7) << 0x1c | uVar147 | uVar132 & 0x8800ffff |
       (src_params->src_height + uVar128) * 0x10000 + 0x7ff0000 & 0x7ff0000);
  uVar132 = (uVar133 & 0xf) << 0xc | (src_params->dst_width + uVar133) - 1 & 0x7ff;
  (ctx->reg).common.reg15 = (anon_struct_4_4_4045accf_for_reg15)(uVar132 | uVar129);
  (ctx->reg).common.reg15 =
       (anon_struct_4_4_4045accf_for_reg15)
       (uVar132 | uVar129 & 0xf800ffff | src_params->dst_height * 0x10000 + 0x7ff0000 & 0x7ff0000);
  (ctx->reg).common.reg20 = (anon_struct_4_2_3349d787_for_reg20)0x88ffffff;
  (ctx->reg).common.reg24 = (anon_struct_4_1_9b21a0fa_for_reg24)(src_params->src).y;
  (ctx->reg).common.reg25 = (anon_struct_4_1_c9127a9e_for_reg25)(src_params->src).cbcr;
  (ctx->reg).common.reg26 = (anon_struct_4_1_c50c69f9_for_reg26)(src_params->dst).y;
  (ctx->reg).common.reg27 = (anon_struct_4_1_dc80d17f_for_reg27)(src_params->dst).cbcr;
  if (src_params->yuv_out_diff != 0) {
    uVar132 = src_params->dst_c_width & 0xf;
    uVar129 = 0x10 - uVar132;
    if (uVar132 == 0) {
      uVar129 = 0;
    }
    (ctx->reg).common.reg1 =
         (anon_struct_4_17_f45c7487_for_reg1)
         ((uint)(ctx->reg).common.reg1 & 0xfffffbff | (src_params->yuv_out_diff & 1) << 10);
    (ctx->reg).common.reg13 =
         (anon_struct_4_2_b89f876b_for_reg13)
         ((src_params->dst_c_width_vir & 0xfffffffc) << 0xe | uVar134);
    aVar1 = (ctx->reg).common.reg16;
    uVar129 = (uVar129 & 0xf) << 0xc | (src_params->dst_c_width + uVar129) - 1 & 0x7ff;
    (ctx->reg).common.reg16 =
         (anon_struct_4_4_effd29bf_for_reg16)(uVar129 | (uint)aVar1 & 0xffff0800);
    (ctx->reg).common.reg16 =
         (anon_struct_4_4_effd29bf_for_reg16)
         (uVar129 | (uint)aVar1 & 0xf8000800 |
         src_params->dst_c_height * 0x10000 + 0x7ff0000 & 0x7ff0000);
    (ctx->reg).common.reg27 = (anon_struct_4_1_dc80d17f_for_reg27)(src_params->dst_c).cbcr;
  }
  set_dmsr_to_vdpp_reg(&src_params->dmsr_params,&ctx->dmsr);
  update_dci_ctl(src_params);
  switch(src_params->dci_format) {
  case 0:
    uVar132 = src_params->src_width_vir;
    uVar129 = uVar132 * 3;
    goto LAB_0013df38;
  case 1:
    uVar129 = src_params->src_width_vir;
    uVar200 = (ulong)uVar129;
    break;
  default:
    _mpp_log_l(2,"vdpp2","warning: unsupported dci format %d",(char *)0x0);
    goto LAB_0013e228;
  case 4:
    uVar129 = src_params->src_width_vir;
    uVar132 = uVar129;
LAB_0013df38:
    uVar200 = (ulong)uVar132;
    uVar129 = uVar129 >> 2;
    break;
  case 5:
    uVar200 = (ulong)src_params->src_width_vir;
    uVar129 = src_params->src_width_vir * 10 >> 5;
  }
  uVar132 = src_params->dci_vsd_mode;
  if ((src_params->dci_hsd_mode & 1) == 0) {
    iVar150 = 0;
    if (0x780 < (uint)uVar200) {
      if (((byte)vdpp2_debug & 2) != 0) {
        _mpp_log_l(4,"vdpp2","w_vir %d hsd mode %d is optimized as mode 1\n",(char *)0x0,uVar200,0);
      }
      goto LAB_0013df9a;
    }
  }
  else {
LAB_0013df9a:
    iVar150 = 1;
  }
  uVar147 = uVar132 & 3;
  if (((uVar132 & 1) == 0) && (0x438 < src_params->src_height_vir)) {
    if (((byte)vdpp2_debug & 2) != 0) {
      _mpp_log_l(4,"vdpp2","h_vir %d vsd mode %d is optimized as mode 1\n",(char *)0x0);
    }
    uVar147 = 1;
LAB_0013dfee:
    if (0x870 < src_params->src_height_vir) {
      if (((byte)vdpp2_debug & 2) != 0) {
        _mpp_log_l(4,"vdpp2","h_vir %d vsd mode %d is optimized as mode 2\n",(char *)0x0);
      }
      uVar147 = 2;
    }
  }
  else if (uVar147 < 2) goto LAB_0013dfee;
  bVar163 = src_params->working_mode == 2;
  if (bVar163) {
    uVar147 = 0;
  }
  uVar132 = src_params->src_height;
  if (bVar163) {
    iVar150 = 0;
  }
  iVar162 = 4;
  if (uVar147 != 2) {
    iVar162 = (uVar147 == 1) + 1;
  }
  if (uVar132 < 0x438) {
    uVar132 = (uVar132 & 0xffff) / (uint)(iVar162 << 4);
  }
  else {
    bVar126 = 6;
    if (uVar147 != 2) {
      bVar126 = uVar147 == 1 | 4;
    }
    uVar132 = (uVar132 - 1) + iVar162 * 0x10 >> bVar126;
  }
  uVar146 = src_params->src_width;
  uVar128 = (iVar150 * 2 + 2) * 0x10;
  if (uVar146 < 0x438) {
    uVar128 = (uVar146 & 0xffff) / uVar128;
  }
  else {
    uVar128 = (uVar146 + uVar128) - 1 >> (byte)iVar150 + 5;
  }
  (ctx->reg).common.reg1 =
       (anon_struct_4_17_f45c7487_for_reg1)
       ((uint)(ctx->reg).common.reg1 & 0xfdffffff | (src_params->hist_cnt_en & 1) << 0x19);
  (ctx->reg).dci.reg0 = (anon_struct_4_1_3a028d4a_for_reg0)(src_params->src).y;
  uVar146 = (uint)*(ushort *)&(ctx->reg).dci.reg1.field_0x2 << 0x10;
  uVar129 = uVar129 & 0xffff;
  (ctx->reg).dci.reg1 = (anon_struct_4_3_07565349_for_reg1)(uVar129 | uVar146);
  uVar133 = (src_params->dci_yrgb_gather_num & 0xf) << 0x10;
  (ctx->reg).dci.reg1 =
       (anon_struct_4_3_07565349_for_reg1)(uVar129 | uVar146 & 0xfff0ffff | uVar133);
  (ctx->reg).dci.reg1 =
       (anon_struct_4_3_07565349_for_reg1)
       (uVar129 | uVar146 & 0xffe0ffff | uVar133 | (src_params->dci_yrgb_gather_en & 1) << 0x14);
  uVar129 = (((uint)(byte)~(byte)iVar150 * 2 | 0xffc) & src_params->src_width) - 1 & 0xfff;
  aVar2 = (ctx->reg).dci.reg2;
  (ctx->reg).dci.reg2 = (anon_struct_4_3_89b91cde_for_reg2)((uint)aVar2 & 0xfffff000 | uVar129);
  (ctx->reg).dci.reg2 =
       (anon_struct_4_3_89b91cde_for_reg2)
       ((uint)aVar2 & 0xf000f000 | uVar129 |
       (-iVar162 & src_params->src_height) * 0x10000 + 0xfff0000 & 0xfff0000);
  aVar3 = (ctx->reg).dci.reg3;
  uVar129 = src_params->dci_format & 7;
  (ctx->reg).dci.reg3 = (anon_struct_4_9_24a09030_for_reg3)((uint)aVar3 & 0xfffffff8 | uVar129);
  uVar129 = (uVar147 << 4 | (uint)aVar3 & 0xffffff80 | uVar129) +
            (src_params->dci_csc_range & 1U) * 8;
  uVar146 = iVar150 << 6;
  (ctx->reg).dci.reg3 = (anon_struct_4_9_24a09030_for_reg3)(uVar146 | uVar129);
  uVar147 = (src_params->dci_alpha_swap & 1U) << 7;
  (ctx->reg).dci.reg3 =
       (anon_struct_4_9_24a09030_for_reg3)(uVar146 | uVar129 & 0xffffff7f | uVar147);
  (ctx->reg).dci.reg3 =
       (anon_struct_4_9_24a09030_for_reg3)
       ((uVar128 & 0xff) << 0x10 | uVar132 << 0x18 | (src_params->dci_rbuv_swap & 1U) << 8 |
       uVar146 | uVar129 & 0xfe7f | uVar147);
  (ctx->reg).dci.reg4 = (anon_struct_4_1_540e9c9c_for_reg4)src_params->hist;
LAB_0013e228:
  local_2b8 = 0;
  uVar129 = (src_params->es_params).es_iWgtGain;
  uVar132 = (src_params->es_params).es_iWgtLocalTh;
  update_es_tan(&src_params->es_params);
  *(byte *)&(ctx->reg).es.reg0 =
       *(byte *)&(ctx->reg).es.reg0 & 0xfe | (byte)(src_params->es_params).es_bEnabledES & 1;
  RVar4 = (src_params->es_params).es_iGradNoDirTh;
  (ctx->reg).es.reg1.field_0x1 = (char)RVar4;
  *(ushort *)&(ctx->reg).es.reg1 =
       (ushort)(byte)(src_params->es_params).es_iGradFlatTh | (ushort)(RVar4 << 8);
  uVar147 = ((src_params->es_params).es_tan_lo_th & 0x1ff) << 0x10;
  aVar5 = (ctx->reg).es.reg2;
  (ctx->reg).es.reg2 = (anon_struct_4_3_30fecd47_for_reg2)((uint)aVar5 & 0xfe00ffff | uVar147);
  (ctx->reg).es.reg2 =
       (anon_struct_4_3_30fecd47_for_reg2)
       ((uint)aVar5 & 0xfe00fe00 | uVar147 | (src_params->es_params).es_tan_hi_th & 0x1ff);
  *(ushort *)&(ctx->reg).es.reg3 =
       SUB42((ctx->reg).es.reg3,0) & 0xfffe |
       (ushort)(src_params->es_params).es_bEndpointCheckEnable & 1;
  uVar147 = (src_params->es_params).es_iK1;
  *(short *)&(ctx->reg).es.reg4 = (short)uVar147;
  (ctx->reg).es.reg4 =
       (anon_struct_4_2_34aad9ab_for_reg4)
       ((src_params->es_params).es_iDeltaLimit << 0x10 | uVar147 & 0xffff);
  RVar4 = (src_params->es_params).es_iK2;
  *(short *)&(ctx->reg).es.reg5.field_0x2 = (short)RVar4;
  (ctx->reg).es.reg5 =
       (anon_struct_4_2_9ad3edb5_for_reg5)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[0] | RVar4 << 0x10);
  RVar4 = (src_params->es_params).es_iDiff2conf_lut_x[1];
  *(short *)&(ctx->reg).es.reg6.field_0x2 = (short)RVar4;
  (ctx->reg).es.reg6 =
       (anon_struct_4_2_02c81542_for_reg6)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[2] | RVar4 << 0x10);
  RVar4 = (src_params->es_params).es_iDiff2conf_lut_x[3];
  *(short *)&(ctx->reg).es.reg7.field_0x2 = (short)RVar4;
  (ctx->reg).es.reg7 =
       (anon_struct_4_2_02c81582_for_reg7)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[4] | RVar4 << 0x10);
  RVar4 = (src_params->es_params).es_iDiff2conf_lut_x[5];
  *(short *)&(ctx->reg).es.reg8.field_0x2 = (short)RVar4;
  (ctx->reg).es.reg8 =
       (anon_struct_4_2_02c815c2_for_reg8)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[6] | RVar4 << 0x10);
  RVar4 = (src_params->es_params).es_iDiff2conf_lut_x[7];
  *(short *)&(ctx->reg).es.reg9.field_0x2 = (short)RVar4;
  (ctx->reg).es.reg9 =
       (anon_struct_4_2_02c81602_for_reg9)
       ((uint)(ushort)(src_params->es_params).es_iDiff2conf_lut_x[8] | RVar4 << 0x10);
  bVar126 = (byte)(src_params->es_params).es_iDiff2conf_lut_y[0];
  aVar55._1_3_ = SUB43((ctx->reg).es.reg10,1);
  aVar55._0_1_ = bVar126;
  (ctx->reg).es.reg10 = aVar55;
  uVar147 = ((src_params->es_params).es_iDiff2conf_lut_y[1] & 0xff) << 8;
  (ctx->reg).es.reg10 = (anon_struct_4_4_73edf603_for_reg10)((uint)aVar55 & 0xffff00ff | uVar147);
  uVar146 = ((src_params->es_params).es_iDiff2conf_lut_y[2] & 0xff) << 0x10;
  (ctx->reg).es.reg10 =
       (anon_struct_4_4_73edf603_for_reg10)((uint)aVar55 & 0xff0000ff | uVar147 | uVar146);
  (ctx->reg).es.reg10 =
       (anon_struct_4_4_73edf603_for_reg10)
       (bVar126 | uVar147 | uVar146 | (src_params->es_params).es_iDiff2conf_lut_y[3] << 0x18);
  bVar126 = (byte)(src_params->es_params).es_iDiff2conf_lut_y[4];
  aVar56._1_3_ = SUB43((ctx->reg).es.reg11,1);
  aVar56._0_1_ = bVar126;
  (ctx->reg).es.reg11 = aVar56;
  uVar146 = ((src_params->es_params).es_iDiff2conf_lut_y[5] & 0xff) << 8;
  (ctx->reg).es.reg11 = (anon_struct_4_4_73efd703_for_reg11)((uint)aVar56 & 0xffff00ff | uVar146);
  uVar147 = ((src_params->es_params).es_iDiff2conf_lut_y[6] & 0xff) << 0x10;
  (ctx->reg).es.reg11 =
       (anon_struct_4_4_73efd703_for_reg11)((uint)aVar56 & 0xff0000ff | uVar146 | uVar147);
  (ctx->reg).es.reg11 =
       (anon_struct_4_4_73efd703_for_reg11)
       (bVar126 | uVar146 | uVar147 | (src_params->es_params).es_iDiff2conf_lut_y[7] << 0x18);
  *(char *)&(ctx->reg).es.reg12 = (char)(src_params->es_params).es_iDiff2conf_lut_y[8];
  RVar4 = (src_params->es_params).es_iDiff2conf_lut_y[0];
  auVar176._4_4_ = RVar4;
  auVar176._0_4_ = RVar4;
  auVar176._8_4_ = RVar4;
  auVar176._12_4_ = RVar4;
  RVar4 = (src_params->es_params).es_iDiff2conf_lut_x[0];
  auVar201._4_4_ = RVar4;
  auVar201._0_4_ = RVar4;
  auVar201._8_4_ = RVar4;
  auVar201._12_4_ = RVar4;
  lVar130 = 0;
  dVar170 = (double)DAT_00153390;
  do {
    auVar187 = *(undefined1 (*) [16])((src_params->es_params).es_iDiff2conf_lut_x + lVar130 + 1);
    auVar193 = *(undefined1 (*) [16])((src_params->es_params).es_iDiff2conf_lut_y + lVar130 + 1);
    auVar182._4_4_ = 0;
    auVar182._0_4_ = auVar201._12_4_;
    auVar182._8_4_ = auVar187._0_4_;
    auVar182._12_4_ = 0;
    dVar173 = DAT_00153390._8_8_;
    auVar202._4_4_ = 0;
    auVar202._0_4_ = auVar187._4_4_;
    auVar202._8_4_ = auVar187._8_4_;
    auVar202._12_4_ = 0;
    auVar188._0_8_ = auVar187._0_8_ & 0xffffffff;
    auVar188._8_4_ = auVar187._4_4_;
    auVar188._12_4_ = 0;
    auVar189._0_8_ =
         (SUB168(auVar188 | _DAT_00153390,0) - dVar170) +
         (dVar170 - SUB168(auVar182 | _DAT_00153390,0));
    auVar189._8_8_ =
         (SUB168(auVar188 | _DAT_00153390,8) - dVar173) +
         (dVar173 - SUB168(auVar182 | _DAT_00153390,8));
    auVar183._4_4_ = 0;
    auVar183._0_4_ = auVar187._8_4_;
    auVar183._8_4_ = auVar187._12_4_;
    auVar183._12_4_ = 0;
    auVar184._0_8_ =
         (SUB168(auVar183 | _DAT_00153390,0) - dVar170) +
         (dVar170 - SUB168(auVar202 | _DAT_00153390,0));
    auVar184._8_8_ =
         (SUB168(auVar183 | _DAT_00153390,8) - dVar173) +
         (dVar173 - SUB168(auVar202 | _DAT_00153390,8));
    auVar191._4_4_ = 0;
    auVar191._0_4_ = auVar193._4_4_;
    auVar191._8_4_ = auVar193._8_4_;
    auVar191._12_4_ = 0;
    auVar164._4_4_ = 0;
    auVar164._0_4_ = auVar176._12_4_;
    auVar164._8_4_ = auVar193._0_4_;
    auVar164._12_4_ = 0;
    auVar174._4_4_ = 0;
    auVar174._0_4_ = auVar193._8_4_;
    auVar174._8_4_ = auVar193._12_4_;
    auVar174._12_4_ = 0;
    auVar206._0_8_ = auVar193._0_8_ & 0xffffffff;
    auVar206._8_4_ = auVar193._4_4_;
    auVar206._12_4_ = 0;
    auVar175._0_8_ =
         ((SUB168(auVar174 | _DAT_00153390,0) - dVar170) +
         (dVar170 - SUB168(auVar191 | _DAT_00153390,0))) * 256.0;
    auVar175._8_8_ =
         ((SUB168(auVar174 | _DAT_00153390,8) - dVar173) +
         (dVar173 - SUB168(auVar191 | _DAT_00153390,8))) * 256.0;
    auVar176 = divpd(auVar175,auVar184);
    auVar207._0_8_ =
         ((SUB168(auVar206 | _DAT_00153390,0) - dVar170) +
         (dVar170 - SUB168(auVar164 | _DAT_00153390,0))) * 256.0;
    auVar207._8_8_ =
         ((SUB168(auVar206 | _DAT_00153390,8) - dVar173) +
         (dVar173 - SUB168(auVar164 | _DAT_00153390,8))) * 256.0;
    dVar173 = auVar176._0_8_;
    dVar179 = auVar176._8_8_;
    auVar176 = divpd(auVar207,auVar189);
    dVar205 = auVar176._0_8_;
    dVar209 = auVar176._8_8_;
    auVar185._0_8_ =
         CONCAT44(-(uint)(dVar209 < (double)(int)dVar209),-(uint)(dVar205 < (double)(int)dVar205));
    auVar185._8_4_ = -(uint)(dVar173 < (double)(int)dVar173);
    auVar185._12_4_ = -(uint)(dVar179 < (double)(int)dVar179);
    auVar192._0_8_ = CONCAT44((int)(dVar209 + -1.0),(int)(dVar205 + -1.0)) & auVar185._0_8_;
    auVar192._8_8_ = CONCAT44((int)(dVar179 + -1.0),(int)(dVar173 + -1.0)) & auVar185._8_8_;
    auVar186._0_8_ = ~auVar185._0_8_ & CONCAT44((int)dVar209,(int)dVar205);
    auVar186._8_8_ = ~auVar185._8_8_ & CONCAT44((int)dVar179,(int)dVar173);
    auVar176 = packssdw(auVar186 | auVar192,auVar186 | auVar192);
    sVar51 = auVar176._0_2_;
    sVar52 = auVar176._2_2_;
    sVar53 = auVar176._4_2_;
    sVar54 = auVar176._6_2_;
    *(uint *)((long)&local_2b8 + lVar130) =
         CONCAT13((0 < sVar54) * (sVar54 < 0x100) * auVar176[6] - (0xff < sVar54),
                  CONCAT12((0 < sVar53) * (sVar53 < 0x100) * auVar176[4] - (0xff < sVar53),
                           CONCAT11((0 < sVar52) * (sVar52 < 0x100) * auVar176[2] - (0xff < sVar52),
                                    (0 < sVar51) * (sVar51 < 0x100) * auVar176[0] - (0xff < sVar51))
                          ));
    lVar130 = lVar130 + 4;
    auVar176 = auVar193;
    auVar201 = auVar187;
  } while (lVar130 != 8);
  uVar129 = (uint)(((float)uVar132 * 256.0) / (float)uVar129);
  if (0xfe < (int)uVar129) {
    uVar129 = 0xff;
  }
  uVar132 = 0;
  if (0 < (int)uVar129) {
    uVar132 = uVar129;
  }
  (ctx->reg).es.reg13 = (anon_struct_4_4_73221983_for_reg13)(uint)local_2b8;
  (ctx->reg).es.reg14 = (anon_struct_4_4_7323fa83_for_reg14)local_2b8._4_4_;
  RVar4 = (src_params->es_params).es_iWgtDecay;
  *(char *)&(ctx->reg).es.reg15 = (char)RVar4;
  *(ushort *)&(ctx->reg).es.reg15 =
       (ushort)((src_params->es_params).es_iWgtGain << 8) | (ushort)RVar4 & 0xff;
  aVar135 = (anon_struct_4_5_566da832_for_reg16)((uint)(ctx->reg).es.reg16 & 0xffffff00 | uVar132);
  (ctx->reg).es.reg16 = aVar135;
  uVar129 = ((src_params->es_params).es_iConfCntTh & 0xf) << 8;
  (ctx->reg).es.reg16 = (anon_struct_4_5_566da832_for_reg16)((uint)aVar135 & 0xfffff0ff | uVar129);
  uVar132 = (src_params->es_params).es_iLowConfTh << 0x18;
  (ctx->reg).es.reg16 =
       (anon_struct_4_5_566da832_for_reg16)((uint)aVar135 & 0xfff0ff | uVar129 | uVar132);
  (ctx->reg).es.reg16 =
       (anon_struct_4_5_566da832_for_reg16)
       ((uint)aVar135 & 0xf0ff | uVar129 | uVar132 |
       ((src_params->es_params).es_iLowConfRatio & 0xff) << 0x10);
  uStack_2a8 = 0;
  uStack_2a4 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  uStack_2ac = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[6] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_d8[4] = 0;
  local_d8[5] = 0;
  local_d8[6] = 0;
  local_d8[0] = 0;
  local_d8[1] = 0;
  local_d8[2] = 0;
  local_d8[3] = 0;
  local_f8[4] = 0;
  local_f8[5] = 0;
  local_f8[6] = 0;
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_f8[2] = 0;
  local_f8[3] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[6] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_158[4] = 0;
  local_158[5] = 0;
  local_158[6] = 0;
  local_158[0] = 0;
  local_158[1] = 0;
  local_158[2] = 0;
  local_158[3] = 0;
  local_178[4] = 0;
  local_178[5] = 0;
  local_178[6] = 0;
  local_178[0] = 0;
  local_178[1] = 0;
  local_178[2] = 0;
  local_178[3] = 0;
  local_198[4] = 0;
  local_198[5] = 0;
  local_198[6] = 0;
  local_198[0] = 0;
  local_198[1] = 0;
  local_198[2] = 0;
  local_198[3] = 0;
  local_1b8[4] = 0;
  local_1b8[5] = 0;
  local_1b8[6] = 0;
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  local_1b8[2] = 0;
  local_1b8[3] = 0;
  local_1d8[4] = 0;
  local_1d8[5] = 0;
  local_1d8[6] = 0;
  local_1d8[0] = 0;
  local_1d8[1] = 0;
  local_1d8[2] = 0;
  local_1d8[3] = 0;
  local_1f8[4] = 0;
  local_1f8[5] = 0;
  local_1f8[6] = 0;
  local_1f8[0] = 0;
  local_1f8[1] = 0;
  local_1f8[2] = 0;
  local_1f8[3] = 0;
  local_218[4] = 0;
  local_218[5] = 0;
  local_218[6] = 0;
  local_218[0] = 0;
  local_218[1] = 0;
  local_218[2] = 0;
  local_218[3] = 0;
  local_238[4] = 0;
  local_238[5] = 0;
  local_238[6] = 0;
  local_238[0] = 0;
  local_238[1] = 0;
  local_238[2] = 0;
  local_238[3] = 0;
  local_258[4] = 0;
  local_258[5] = 0;
  local_258[6] = 0;
  local_258[0] = 0;
  local_258[1] = 0;
  local_258[2] = 0;
  local_258[3] = 0;
  local_278[4] = 0;
  local_278[5] = 0;
  local_278[6] = 0;
  local_278[0] = 0;
  local_278[1] = 0;
  local_278[2] = 0;
  local_278[3] = 0;
  local_298[4] = 0;
  local_298[5] = 0;
  local_298[6] = 0;
  local_298[0] = 0;
  local_298[1] = 0;
  local_298[2] = 0;
  local_298[3] = 0;
  aVar6 = (ctx->reg).sharp.reg0;
  uVar132 = (ushort)(src_params->shp_params).sharp_enable & 1;
  uVar142 = aVar6._0_2_;
  uVar131 = (ushort)uVar132;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar142 & 0xfffe | uVar131;
  uVar129 = 2;
  if ((src_params->shp_params).lti_h_enable == 0) {
    uVar129 = (uint)((src_params->shp_params).lti_v_enable != 0) * 2;
  }
  *(ushort *)&(ctx->reg).sharp.reg0 = (ushort)uVar129 | uVar142 & 0xfffc | uVar131;
  uVar132 = (uVar129 | (uint)aVar6 & 0xfffffff8 | uVar132) +
            ((src_params->shp_params).cti_h_enable & 1U) * 4;
  *(short *)&(ctx->reg).sharp.reg0 = (short)uVar132;
  uVar147 = (uVar132 & 0xfffffff7) + ((src_params->shp_params).peaking_enable & 1U) * 8;
  uVar131 = (ushort)uVar147;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar131;
  uVar132 = 0x10;
  if (((src_params->shp_params).peaking_coring_enable == 0) &&
     ((src_params->shp_params).peaking_gain_enable == 0)) {
    uVar132 = (uint)((src_params->shp_params).peaking_limit_ctrl_enable != 0) << 4;
  }
  uVar121 = (ushort)uVar132;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar121 | uVar131 & 0xffef;
  uVar146 = ((src_params->shp_params).peaking_edge_ctrl_enable & 1U) << 6;
  uVar142 = (ushort)uVar146;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar121 | uVar131 & 0xffaf | uVar142;
  uVar128 = ((src_params->shp_params).shootctrl_enable & 1U) << 7;
  uVar64 = (ushort)uVar128;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar121 | uVar131 & 0xff2f | uVar142 | uVar64;
  uVar133 = ((src_params->shp_params).global_gain_enable & 1U) << 8;
  uVar122 = (ushort)uVar133;
  *(ushort *)&(ctx->reg).sharp.reg0 = uVar121 | uVar131 & 0xfe2f | uVar142 | uVar64 | uVar122;
  uVar134 = ((src_params->shp_params).color_ctrl_enable & 1U) << 9;
  uVar123 = (ushort)uVar134;
  *(ushort *)&(ctx->reg).sharp.reg0 =
       uVar121 | uVar131 & 0xfc2f | uVar142 | uVar64 | uVar122 | uVar123;
  uVar138 = ((src_params->shp_params).tex_adj_enable & 1U) << 10;
  *(ushort *)&(ctx->reg).sharp.reg0 =
       uVar121 | uVar131 & 0xf82f | uVar142 | uVar64 | uVar122 | uVar123 | (ushort)uVar138;
  uVar132 = uVar132 | uVar147 & 0xffffc02f | uVar146 | uVar128 | uVar133 | uVar134 | uVar138 |
            ((src_params->shp_params).sharp_coloradj_bypass_en & 1U) << 0xb;
  *(short *)&(ctx->reg).sharp.reg0 = (short)uVar132;
  if (((ushort)uVar129 != 0) && ((src_params->shp_params).lti_h_enable == 0)) {
    (src_params->shp_params).lti_h_gain = 0;
    uVar132 = (uint)*(ushort *)&(ctx->reg).sharp.reg0;
  }
  if (((uVar132 & 2) != 0) && ((src_params->shp_params).lti_v_enable == 0)) {
    (src_params->shp_params).lti_v_gain = 0;
  }
  uVar129 = (src_params->shp_params).lti_h_radius & 1;
  aVar7 = (ctx->reg).sharp.reg162;
  aVar8 = (ctx->reg).sharp.reg164;
  (ctx->reg).sharp.reg162 =
       (anon_struct_4_5_ac9e8c85_for_reg162)((uint)aVar7 & 0xfffffffe | uVar129);
  uVar132 = ((src_params->shp_params).lti_h_slope & 0x1ffU) << 4;
  (ctx->reg).sharp.reg162 =
       (anon_struct_4_5_ac9e8c85_for_reg162)((uint)aVar7 & 0xffffe00e | uVar129 | uVar132);
  (ctx->reg).sharp.reg162 =
       (anon_struct_4_5_ac9e8c85_for_reg162)
       ((uint)aVar7 & 0xfe00e00e | uVar129 | uVar132 |
       ((src_params->shp_params).lti_h_thresold & 0x1ffU) << 0x10);
  uVar129 = (src_params->shp_params).lti_h_noise_thr_neg & 0x3ff;
  aVar9 = (ctx->reg).sharp.reg163;
  (ctx->reg).sharp.reg163 =
       (anon_struct_4_5_e9729c4a_for_reg163)((uint)aVar9 & 0xfffffc00 | uVar129);
  uVar132 = ((src_params->shp_params).lti_h_noise_thr_pos & 0x3ffU) << 0xc;
  (ctx->reg).sharp.reg163 =
       (anon_struct_4_5_e9729c4a_for_reg163)((uint)aVar9 & 0xffc00c00 | uVar129 | uVar132);
  (ctx->reg).sharp.reg163 =
       (anon_struct_4_5_e9729c4a_for_reg163)
       ((uint)aVar9 & 0xe0c00c00 | uVar129 | uVar132 |
       ((src_params->shp_params).lti_h_gain & 0x1fU) << 0x18);
  uVar129 = (src_params->shp_params).lti_v_radius & 1;
  (ctx->reg).sharp.reg164 =
       (anon_struct_4_5_051dd277_for_reg164)((uint)aVar8 & 0xfffffffe | uVar129);
  uVar132 = ((src_params->shp_params).lti_v_slope & 0x1ffU) << 4;
  (ctx->reg).sharp.reg164 =
       (anon_struct_4_5_051dd277_for_reg164)((uint)aVar8 & 0xffffe00e | uVar129 | uVar132);
  (ctx->reg).sharp.reg164 =
       (anon_struct_4_5_051dd277_for_reg164)
       ((uint)aVar8 & 0xfe00e00e | uVar129 | uVar132 |
       ((src_params->shp_params).lti_v_thresold & 0x1ffU) << 0x10);
  uVar129 = (src_params->shp_params).lti_v_noise_thr_neg & 0x3ff;
  aVar10 = (ctx->reg).sharp.reg165;
  (ctx->reg).sharp.reg165 =
       (anon_struct_4_5_dbe3e6bc_for_reg165)((uint)aVar10 & 0xfffffc00 | uVar129);
  uVar132 = ((src_params->shp_params).lti_v_noise_thr_pos & 0x3ffU) << 0xc;
  (ctx->reg).sharp.reg165 =
       (anon_struct_4_5_dbe3e6bc_for_reg165)((uint)aVar10 & 0xffc00c00 | uVar129 | uVar132);
  (ctx->reg).sharp.reg165 =
       (anon_struct_4_5_dbe3e6bc_for_reg165)
       ((uint)aVar10 & 0xe0c00c00 | uVar129 | uVar132 |
       ((src_params->shp_params).lti_v_gain & 0x1fU) << 0x18);
  aVar11 = (ctx->reg).sharp.reg166;
  uVar129 = (src_params->shp_params).cti_h_radius & 1;
  (ctx->reg).sharp.reg166 =
       (anon_struct_4_5_7d0670dc_for_reg166)((uint)aVar11 & 0xfffffffe | uVar129);
  uVar132 = ((src_params->shp_params).cti_h_slope & 0x1ffU) << 4;
  (ctx->reg).sharp.reg166 =
       (anon_struct_4_5_7d0670dc_for_reg166)((uint)aVar11 & 0xffffe00e | uVar129 | uVar132);
  (ctx->reg).sharp.reg166 =
       (anon_struct_4_5_7d0670dc_for_reg166)
       ((uint)aVar11 & 0xfe00e00e | uVar129 | uVar132 |
       ((src_params->shp_params).cti_h_thresold & 0x1ffU) << 0x10);
  uVar132 = (src_params->shp_params).cti_h_noise_thr_neg & 0x3ff;
  aVar12 = (ctx->reg).sharp.reg167;
  (ctx->reg).sharp.reg167 =
       (anon_struct_4_5_ee4e9261_for_reg167)((uint)aVar12 & 0xfffffc00 | uVar132);
  uVar129 = ((src_params->shp_params).cti_h_noise_thr_pos & 0x3ffU) << 0xc;
  (ctx->reg).sharp.reg167 =
       (anon_struct_4_5_ee4e9261_for_reg167)((uint)aVar12 & 0xffc00c00 | uVar132 | uVar129);
  (ctx->reg).sharp.reg167 =
       (anon_struct_4_5_ee4e9261_for_reg167)
       ((uint)aVar12 & 0xe0c00c00 | uVar132 | uVar129 |
       ((src_params->shp_params).cti_h_gain & 0x1fU) << 0x18);
  iVar150 = (src_params->shp_params).peaking_coring_enable;
  iVar162 = (src_params->shp_params).peaking_gain_enable;
  iVar151 = (src_params->shp_params).peaking_limit_ctrl_enable;
  lVar130 = 0;
  do {
    iVar145 = 0x400;
    iVar141 = 0x400;
    iVar148 = 0;
    iVar144 = 0;
    if (iVar150 == 1) {
      iVar141 = *(int *)((long)(src_params->shp_params).peaking_coring_ratio + lVar130);
      iVar148 = *(int *)((long)(src_params->shp_params).peaking_coring_zero + lVar130) >> 2;
      iVar144 = *(int *)((long)(src_params->shp_params).peaking_coring_thr + lVar130) >> 2;
    }
    iVar153 = 0x400;
    if (iVar162 == 1) {
      iVar145 = *(int *)((long)(src_params->shp_params).peaking_gain_pos + lVar130);
      iVar153 = *(int *)((long)(src_params->shp_params).peaking_gain_neg + lVar130);
    }
    if (iVar151 == 1) {
      local_2dc = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_pos0 + lVar130) >> 2;
      iVar157 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_pos1 + lVar130) >> 2;
      iVar139 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_neg0 + lVar130) >> 2;
      iVar136 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_neg1 + lVar130) >> 2;
      iVar158 = *(int *)((long)(src_params->shp_params).peaking_limit_ctrl_ratio + lVar130);
    }
    else {
      iVar158 = 0x400;
      local_2dc = 0x3f;
      iVar157 = 0x3f;
      iVar139 = 0x3f;
      iVar136 = 0x3f;
    }
    iVar155 = -iVar144;
    iVar140 = -iVar139;
    iVar154 = iVar153 * iVar141 + 0x200 >> 10;
    iVar156 = -(iVar154 * (iVar144 - iVar148) + 0x200 >> 10);
    iVar149 = -iVar148;
    if (0xfe < -iVar148) {
      iVar149 = 0xff;
    }
    if (iVar149 < -0xff) {
      iVar149 = -0x100;
    }
    if (0xfe < iVar155) {
      iVar155 = 0xff;
    }
    if (iVar155 < -0xff) {
      iVar155 = -0x100;
    }
    if (0xfe < iVar140) {
      iVar140 = 0xff;
    }
    iVar152 = -0x100;
    if (iVar140 < -0xff) {
      iVar140 = -0x100;
    }
    iVar57 = -iVar136;
    if (0xfe < -iVar136) {
      iVar57 = 0xff;
    }
    *(int *)((long)local_58 + lVar130) = iVar149;
    if (iVar57 < -0xff) {
      iVar57 = iVar152;
    }
    *(int *)((long)local_98 + lVar130) = iVar155;
    iVar149 = iVar148;
    if (0xfe < iVar148) {
      iVar149 = 0xff;
    }
    *(int *)((long)local_d8 + lVar130) = iVar140;
    if (iVar149 < -0xff) {
      iVar149 = iVar152;
    }
    iVar155 = 0xff;
    if (iVar144 < 0xff) {
      iVar155 = iVar144;
    }
    *(int *)((long)local_118 + lVar130) = iVar57;
    if (iVar155 < -0xff) {
      iVar155 = iVar152;
    }
    iVar140 = 0xff;
    if (local_2dc < 0xff) {
      iVar140 = local_2dc;
    }
    *(int *)((long)&local_2b8 + lVar130) = iVar149;
    if (iVar140 < -0xff) {
      iVar140 = -0x100;
    }
    iVar149 = 0xff;
    if (iVar157 < 0xff) {
      iVar149 = iVar157;
    }
    *(int *)((long)local_78 + lVar130) = iVar155;
    if (iVar149 < -0xff) {
      iVar149 = -0x100;
    }
    *(int *)((long)local_b8 + lVar130) = iVar140;
    *(int *)((long)local_f8 + lVar130) = iVar149;
    iVar149 = iVar156;
    if (0xfe < iVar156) {
      iVar149 = 0xff;
    }
    if (iVar149 < -0xff) {
      iVar149 = -0x100;
    }
    iVar156 = iVar156 - ((iVar139 - iVar144) * iVar153 + 0x200 >> 10);
    *(int *)((long)local_138 + lVar130) = iVar149;
    iVar149 = iVar156;
    if (0xfe < iVar156) {
      iVar149 = 0xff;
    }
    if (iVar149 < -0xff) {
      iVar149 = -0x100;
    }
    iVar155 = iVar158 * iVar153 + 0x200 >> 10;
    iVar156 = iVar156 - ((iVar136 - iVar139) * iVar155 + 0x200 >> 10);
    *(int *)((long)local_158 + lVar130) = iVar149;
    if (0xfe < iVar156) {
      iVar156 = 0xff;
    }
    if (iVar156 < -0xff) {
      iVar156 = -0x100;
    }
    iVar141 = iVar141 * iVar145 + 0x200 >> 10;
    iVar136 = (iVar144 - iVar148) * iVar141 + 0x200 >> 10;
    *(int *)((long)local_178 + lVar130) = iVar156;
    iVar148 = iVar136;
    if (0xfe < iVar136) {
      iVar148 = 0xff;
    }
    if (iVar148 < -0xff) {
      iVar148 = -0x100;
    }
    iVar136 = ((local_2dc - iVar144) * iVar145 + 0x200 >> 10) + iVar136;
    *(int *)((long)local_198 + lVar130) = iVar148;
    iVar144 = iVar136;
    if (0xfe < iVar136) {
      iVar144 = 0xff;
    }
    if (iVar144 < -0xff) {
      iVar144 = -0x100;
    }
    iVar148 = iVar158 * iVar145 + 0x200 >> 10;
    iVar136 = ((iVar157 - local_2dc) * iVar148 + 0x200 >> 10) + iVar136;
    *(int *)((long)local_1b8 + lVar130) = iVar144;
    if (0xfe < iVar136) {
      iVar136 = 0xff;
    }
    if (iVar136 < -0xff) {
      iVar136 = -0x100;
    }
    *(int *)((long)local_1d8 + lVar130) = iVar136;
    if (0xffe < iVar141) {
      iVar141 = 0xfff;
    }
    if (iVar141 < 1) {
      iVar141 = 0;
    }
    *(int *)((long)local_1f8 + lVar130) = iVar141;
    if (0xffe < iVar145) {
      iVar145 = 0xfff;
    }
    if (iVar145 < 1) {
      iVar145 = 0;
    }
    *(int *)((long)local_218 + lVar130) = iVar145;
    if (0xffe < iVar148) {
      iVar148 = 0xfff;
    }
    if (iVar148 < 1) {
      iVar148 = 0;
    }
    *(int *)((long)local_238 + lVar130) = iVar148;
    if (0xffe < iVar154) {
      iVar154 = 0xfff;
    }
    if (iVar154 < 1) {
      iVar154 = 0;
    }
    *(int *)((long)local_258 + lVar130) = iVar154;
    if (0xffe < iVar153) {
      iVar153 = 0xfff;
    }
    if (iVar153 < 1) {
      iVar153 = 0;
    }
    *(int *)((long)local_278 + lVar130) = iVar153;
    if (0xffe < iVar155) {
      iVar155 = 0xfff;
    }
    if (iVar155 < 1) {
      iVar155 = 0;
    }
    *(int *)((long)local_298 + lVar130) = iVar155;
    lVar130 = lVar130 + 4;
  } while (lVar130 != 0x1c);
  aVar66 = (ctx->reg).sharp.reg13;
  aVar67 = (ctx->reg).sharp.reg14;
  aVar68 = (ctx->reg).sharp.reg15;
  aVar69 = (ctx->reg).sharp.reg16;
  aVar70 = (ctx->reg).sharp.reg17;
  aVar71 = (ctx->reg).sharp.reg18;
  aVar72 = (ctx->reg).sharp.reg19;
  (ctx->reg).sharp.reg12 =
       (anon_struct_4_3_f795cdaa_for_reg12)
       (((uint)local_98._0_8_ & 0x1ff) << 0x10 |
       (uint)(ctx->reg).sharp.reg12 & 0xfe00fe00 | (uint)local_58._0_8_ & 0x1ff);
  (ctx->reg).sharp.reg13 =
       (anon_struct_4_3_f795cdea_for_reg13)
       ((local_118[0] & 0x1ff) << 0x10 | (uint)aVar66 & 0xfe00fe00 | local_d8[0] & 0x1ff);
  (ctx->reg).sharp.reg14 =
       (anon_struct_4_3_f795d56a_for_reg14)
       ((local_78[0] & 0x1ff) << 0x10 | (uint)aVar67 & 0xfe00fe00 | (uint)local_2b8 & 0x1ff);
  (ctx->reg).sharp.reg15 =
       (anon_struct_4_3_f795d5aa_for_reg15)
       ((local_f8[0] & 0x1ff) << 0x10 | (uint)aVar68 & 0xfe00fe00 | local_b8[0] & 0x1ff);
  (ctx->reg).sharp.reg16 =
       (anon_struct_4_3_c249374a_for_reg16)
       (((uint)local_158._0_8_ & 0x1ff) << 0x10 |
       (uint)aVar69 & 0xfe00fe00 | (uint)local_138._0_8_ & 0x1ff);
  (ctx->reg).sharp.reg17 =
       (anon_struct_4_3_c24937c5_for_reg17)
       ((local_198[0] & 0x1ff) << 0x10 | (uint)aVar70 & 0xfe00fe00 | local_178[0] & 0x1ff);
  (ctx->reg).sharp.reg18 =
       (anon_struct_4_3_c2493f2a_for_reg18)
       ((local_1d8[0] & 0x1ff) << 0x10 | (uint)aVar71 & 0xfe00fe00 | local_1b8[0] & 0x1ff);
  (ctx->reg).sharp.reg19 =
       (anon_struct_4_3_a38c4f29_for_reg19)
       ((local_278[0] & 0xfff) << 0x10 | (uint)aVar72 & 0xf000f000 | local_258[0] & 0xfff);
  (ctx->reg).sharp.reg20 =
       (anon_struct_4_3_a38c5e4b_for_reg20)
       ((local_1f8[0] & 0xfff) << 0x10 |
       (uint)(ctx->reg).sharp.reg20 & 0xf000f000 | local_298[0] & 0xfff);
  (ctx->reg).sharp.reg21 =
       (anon_struct_4_2_eef66cc1_for_reg21)
       ((local_238[0] & 0xfff) << 0xc |
       local_218[0] & 0xfff | (uint)(byte)(ctx->reg).sharp.reg21.field_0x3 << 0x18);
  aVar73 = (ctx->reg).sharp.reg24;
  aVar74 = (ctx->reg).sharp.reg25;
  aVar75 = (ctx->reg).sharp.reg26;
  (ctx->reg).sharp.reg23 =
       (anon_struct_4_3_f3bb698a_for_reg23)
       ((local_98[1] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg23 & 0xfe00fe00 | local_58[1] & 0x1ffU);
  (ctx->reg).sharp.reg24 =
       (anon_struct_4_3_f3bb69ca_for_reg24)
       ((local_118[1] & 0x1ff) << 0x10 | (uint)aVar73 & 0xfe00fe00 | local_d8[1] & 0x1ff);
  (ctx->reg).sharp.reg25 =
       (anon_struct_4_3_f3bb714a_for_reg25)
       ((local_78[1] & 0x1ff) << 0x10 | (uint)aVar74 & 0xfe00fe00 | local_2b8._4_4_ & 0x1ff);
  (ctx->reg).sharp.reg26 =
       (anon_struct_4_3_f3bb718a_for_reg26)
       ((local_f8[1] & 0x1ff) << 0x10 | (uint)aVar75 & 0xfe00fe00 | local_b8[1] & 0x1ff);
  aVar76 = (ctx->reg).sharp.reg28;
  aVar77 = (ctx->reg).sharp.reg29;
  aVar78 = (ctx->reg).sharp.reg30;
  (ctx->reg).sharp.reg27 =
       (anon_struct_4_3_4b775b2a_for_reg27)
       ((local_158[1] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg27 & 0xfe00fe00 | local_138[1] & 0x1ffU);
  (ctx->reg).sharp.reg28 =
       (anon_struct_4_3_4b775ba5_for_reg28)
       ((local_198[1] & 0x1ff) << 0x10 | (uint)aVar76 & 0xfe00fe00 | local_178[1] & 0x1ff);
  (ctx->reg).sharp.reg29 =
       (anon_struct_4_3_4b77630a_for_reg29)
       ((local_1d8[1] & 0x1ff) << 0x10 | (uint)aVar77 & 0xfe00fe00 | local_1b8[1] & 0x1ff);
  (ctx->reg).sharp.reg30 =
       (anon_struct_4_3_4022a749_for_reg30)
       ((local_278[1] & 0xfff) << 0x10 | (uint)aVar78 & 0xf000f000 | local_258[1] & 0xfff);
  (ctx->reg).sharp.reg31 =
       (anon_struct_4_3_4022b66b_for_reg31)
       ((local_1f8[1] & 0xfff) << 0x10 |
       (uint)(ctx->reg).sharp.reg31 & 0xf000f000 | local_298[1] & 0xfff);
  (ctx->reg).sharp.reg32 =
       (anon_struct_4_2_8b8cc4e1_for_reg32)
       ((local_238[1] & 0xfff) << 0xc |
       local_218[1] & 0xfff | (uint)(byte)(ctx->reg).sharp.reg32.field_0x3 << 0x18);
  aVar79 = (ctx->reg).sharp.reg35;
  aVar80 = (ctx->reg).sharp.reg36;
  aVar81 = (ctx->reg).sharp.reg37;
  (ctx->reg).sharp.reg34 =
       (anon_struct_4_3_efe1056a_for_reg34)
       ((local_98[2] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg34 & 0xfe00fe00 | local_58[2] & 0x1ffU);
  (ctx->reg).sharp.reg35 =
       (anon_struct_4_3_efe105aa_for_reg35)
       ((local_118[2] & 0x1ff) << 0x10 | (uint)aVar79 & 0xfe00fe00 | local_d8[2] & 0x1ff);
  (ctx->reg).sharp.reg36 =
       (anon_struct_4_3_efe10d2a_for_reg36)
       ((local_78[2] & 0x1ff) << 0x10 | (uint)aVar80 & 0xfe00fe00 | uStack_2b0 & 0x1ff);
  (ctx->reg).sharp.reg37 =
       (anon_struct_4_3_efe10d6a_for_reg37)
       ((local_f8[2] & 0x1ff) << 0x10 | (uint)aVar81 & 0xfe00fe00 | local_b8[2] & 0x1ff);
  aVar82 = (ctx->reg).sharp.reg39;
  aVar83 = (ctx->reg).sharp.reg40;
  aVar84 = (ctx->reg).sharp.reg41;
  (ctx->reg).sharp.reg38 =
       (anon_struct_4_3_d4a57f0a_for_reg38)
       ((local_158[2] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg38 & 0xfe00fe00 | local_138[2] & 0x1ffU);
  (ctx->reg).sharp.reg39 =
       (anon_struct_4_3_d4a57f85_for_reg39)
       ((local_198[2] & 0x1ff) << 0x10 | (uint)aVar82 & 0xfe00fe00 | local_178[2] & 0x1ff);
  (ctx->reg).sharp.reg40 =
       (anon_struct_4_3_d4a586ea_for_reg40)
       ((local_1d8[2] & 0x1ff) << 0x10 | (uint)aVar83 & 0xfe00fe00 | local_1b8[2] & 0x1ff);
  (ctx->reg).sharp.reg41 =
       (anon_struct_4_3_dcb8ff69_for_reg41)
       ((local_278[2] & 0xfff) << 0x10 | (uint)aVar84 & 0xf000f000 | local_258[2] & 0xfff);
  (ctx->reg).sharp.reg42 =
       (anon_struct_4_3_dcb90e8b_for_reg42)
       ((local_1f8[2] & 0xfff) << 0x10 |
       (uint)(ctx->reg).sharp.reg42 & 0xf000f000 | local_298[2] & 0xfff);
  (ctx->reg).sharp.reg43 =
       (anon_struct_4_2_28231d01_for_reg43)
       ((local_238[2] & 0xfff) << 0xc |
       local_218[2] & 0xfff | (uint)(byte)(ctx->reg).sharp.reg43.field_0x3 << 0x18);
  aVar85 = (ctx->reg).sharp.reg46;
  aVar86 = (ctx->reg).sharp.reg47;
  aVar87 = (ctx->reg).sharp.reg48;
  (ctx->reg).sharp.reg45 =
       (anon_struct_4_3_ec06a14a_for_reg45)
       ((local_98[3] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg45 & 0xfe00fe00 | local_58[3] & 0x1ffU);
  (ctx->reg).sharp.reg46 =
       (anon_struct_4_3_ec06a18a_for_reg46)
       ((local_118[3] & 0x1ff) << 0x10 | (uint)aVar85 & 0xfe00fe00 | local_d8[3] & 0x1ff);
  (ctx->reg).sharp.reg47 =
       (anon_struct_4_3_ec06a90a_for_reg47)
       ((local_78[3] & 0x1ff) << 0x10 | (uint)aVar86 & 0xfe00fe00 | uStack_2ac & 0x1ff);
  (ctx->reg).sharp.reg48 =
       (anon_struct_4_3_ec06a94a_for_reg48)
       ((local_f8[3] & 0x1ff) << 0x10 | (uint)aVar87 & 0xfe00fe00 | local_b8[3] & 0x1ff);
  aVar88 = (ctx->reg).sharp.reg50;
  aVar89 = (ctx->reg).sharp.reg51;
  aVar90 = (ctx->reg).sharp.reg52;
  (ctx->reg).sharp.reg49 =
       (anon_struct_4_3_5dd3a2ea_for_reg49)
       ((local_158[3] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg49 & 0xfe00fe00 | local_138[3] & 0x1ffU);
  (ctx->reg).sharp.reg50 =
       (anon_struct_4_3_5dd3a365_for_reg50)
       ((local_198[3] & 0x1ff) << 0x10 | (uint)aVar88 & 0xfe00fe00 | local_178[3] & 0x1ff);
  (ctx->reg).sharp.reg51 =
       (anon_struct_4_3_5dd3aaca_for_reg51)
       ((local_1d8[3] & 0x1ff) << 0x10 | (uint)aVar89 & 0xfe00fe00 | local_1b8[3] & 0x1ff);
  (ctx->reg).sharp.reg52 =
       (anon_struct_4_3_794f5789_for_reg52)
       ((local_278[3] & 0xfff) << 0x10 | (uint)aVar90 & 0xf000f000 | local_258[3] & 0xfff);
  (ctx->reg).sharp.reg53 =
       (anon_struct_4_3_794f66ab_for_reg53)
       ((local_1f8[3] & 0xfff) << 0x10 |
       (uint)(ctx->reg).sharp.reg53 & 0xf000f000 | local_298[3] & 0xfff);
  (ctx->reg).sharp.reg54 =
       (anon_struct_4_2_c4b97521_for_reg54)
       ((local_238[3] & 0xfff) << 0xc |
       local_218[3] & 0xfff | (uint)(byte)(ctx->reg).sharp.reg54.field_0x3 << 0x18);
  aVar91 = (ctx->reg).sharp.reg57;
  aVar92 = (ctx->reg).sharp.reg58;
  aVar93 = (ctx->reg).sharp.reg59;
  (ctx->reg).sharp.reg56 =
       (anon_struct_4_3_e82c3d2a_for_reg56)
       ((local_98[4] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg56 & 0xfe00fe00 | local_58[4] & 0x1ffU);
  (ctx->reg).sharp.reg57 =
       (anon_struct_4_3_e82c3d6a_for_reg57)
       ((local_118[4] & 0x1ff) << 0x10 | (uint)aVar91 & 0xfe00fe00 | local_d8[4] & 0x1ff);
  (ctx->reg).sharp.reg58 =
       (anon_struct_4_3_e82c44ea_for_reg58)
       ((local_78[4] & 0x1ff) << 0x10 | (uint)aVar92 & 0xfe00fe00 | uStack_2a8 & 0x1ff);
  (ctx->reg).sharp.reg59 =
       (anon_struct_4_3_e82c452a_for_reg59)
       ((local_f8[4] & 0x1ff) << 0x10 | (uint)aVar93 & 0xfe00fe00 | local_b8[4] & 0x1ff);
  aVar94 = (ctx->reg).sharp.reg61;
  aVar95 = (ctx->reg).sharp.reg62;
  aVar96 = (ctx->reg).sharp.reg63;
  (ctx->reg).sharp.reg60 =
       (anon_struct_4_3_e701c6ca_for_reg60)
       ((local_158[4] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg60 & 0xfe00fe00 | local_138[4] & 0x1ffU);
  (ctx->reg).sharp.reg61 =
       (anon_struct_4_3_e701c745_for_reg61)
       ((local_198[4] & 0x1ff) << 0x10 | (uint)aVar94 & 0xfe00fe00 | local_178[4] & 0x1ff);
  (ctx->reg).sharp.reg62 =
       (anon_struct_4_3_e701ceaa_for_reg62)
       ((local_1d8[4] & 0x1ff) << 0x10 | (uint)aVar95 & 0xfe00fe00 | local_1b8[4] & 0x1ff);
  (ctx->reg).sharp.reg63 =
       (anon_struct_4_3_15e5afa9_for_reg63)
       ((local_278[4] & 0xfff) << 0x10 | (uint)aVar96 & 0xf000f000 | local_258[4] & 0xfff);
  (ctx->reg).sharp.reg64 =
       (anon_struct_4_3_15e5becb_for_reg64)
       ((local_1f8[4] & 0xfff) << 0x10 |
       (uint)(ctx->reg).sharp.reg64 & 0xf000f000 | local_298[4] & 0xfff);
  (ctx->reg).sharp.reg65 =
       (anon_struct_4_2_614fcd41_for_reg65)
       ((local_238[4] & 0xfff) << 0xc |
       local_218[4] & 0xfff | (uint)(byte)(ctx->reg).sharp.reg65.field_0x3 << 0x18);
  aVar97 = (ctx->reg).sharp.reg68;
  aVar98 = (ctx->reg).sharp.reg69;
  aVar99 = (ctx->reg).sharp.reg70;
  (ctx->reg).sharp.reg67 =
       (anon_struct_4_3_e451d90a_for_reg67)
       ((local_98[5] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg67 & 0xfe00fe00 | local_58[5] & 0x1ffU);
  (ctx->reg).sharp.reg68 =
       (anon_struct_4_3_e451d94a_for_reg68)
       ((local_118[5] & 0x1ff) << 0x10 | (uint)aVar97 & 0xfe00fe00 | local_d8[5] & 0x1ff);
  (ctx->reg).sharp.reg69 =
       (anon_struct_4_3_e451e0ca_for_reg69)
       ((local_78[5] & 0x1ff) << 0x10 | (uint)aVar98 & 0xfe00fe00 | (uint)uStack_2a4 & 0x1ff);
  (ctx->reg).sharp.reg70 =
       (anon_struct_4_3_e451e10a_for_reg70)
       ((local_f8[5] & 0x1ff) << 0x10 | (uint)aVar99 & 0xfe00fe00 | local_b8[5] & 0x1ff);
  aVar100 = (ctx->reg).sharp.reg72;
  aVar101 = (ctx->reg).sharp.reg73;
  aVar102 = (ctx->reg).sharp.reg74;
  (ctx->reg).sharp.reg71 =
       (anon_struct_4_3_702feaaa_for_reg71)
       ((local_158[5] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg71 & 0xfe00fe00 | local_138[5] & 0x1ffU);
  (ctx->reg).sharp.reg72 =
       (anon_struct_4_3_702feb25_for_reg72)
       ((local_198[5] & 0x1ff) << 0x10 | (uint)aVar100 & 0xfe00fe00 | local_178[5] & 0x1ff);
  (ctx->reg).sharp.reg73 =
       (anon_struct_4_3_702ff28a_for_reg73)
       ((local_1d8[5] & 0x1ff) << 0x10 | (uint)aVar101 & 0xfe00fe00 | local_1b8[5] & 0x1ff);
  (ctx->reg).sharp.reg74 =
       (anon_struct_4_3_b27c07c9_for_reg74)
       ((local_278[5] & 0xfff) << 0x10 | (uint)aVar102 & 0xf000f000 | local_258[5] & 0xfff);
  (ctx->reg).sharp.reg75 =
       (anon_struct_4_3_b27c16eb_for_reg75)
       ((local_1f8[5] & 0xfff) << 0x10 |
       (uint)(ctx->reg).sharp.reg75 & 0xf000f000 | local_298[5] & 0xfff);
  (ctx->reg).sharp.reg76 =
       (anon_struct_4_2_fde62561_for_reg76)
       ((local_238[5] & 0xfff) << 0xc |
       local_218[5] & 0xfff | (uint)(byte)(ctx->reg).sharp.reg76.field_0x3 << 0x18);
  aVar108 = (ctx->reg).sharp.reg79;
  aVar109 = (ctx->reg).sharp.reg80;
  aVar110 = (ctx->reg).sharp.reg81;
  (ctx->reg).sharp.reg78 =
       (anon_struct_4_3_e07774ea_for_reg78)
       ((local_98[6] & 0xfffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg78 & 0xf000f000 | local_58[6] & 0xfffU);
  (ctx->reg).sharp.reg79 =
       (anon_struct_4_3_e077752a_for_reg79)
       ((local_118[6] & 0x1ff) << 0x10 | (uint)aVar108 & 0xfe00fe00 | local_d8[6] & 0x1ff);
  (ctx->reg).sharp.reg80 =
       (anon_struct_4_3_e0777caa_for_reg80)
       ((local_78[6] & 0x1ff) << 0x10 | (uint)aVar109 & 0xfe00fe00 | uStack_2a4._4_4_ & 0x1ff);
  (ctx->reg).sharp.reg81 =
       (anon_struct_4_3_e0777cea_for_reg81)
       ((local_f8[6] & 0x1ff) << 0x10 | (uint)aVar110 & 0xfe00fe00 | local_b8[6] & 0x1ff);
  aVar103 = (ctx->reg).sharp.reg83;
  aVar104 = (ctx->reg).sharp.reg84;
  aVar105 = (ctx->reg).sharp.reg85;
  (ctx->reg).sharp.reg82 =
       (anon_struct_4_3_f95e0e8a_for_reg82)
       ((local_158[6] & 0x1ffU) << 0x10 |
       (uint)(ctx->reg).sharp.reg82 & 0xfe00fe00 | local_138[6] & 0x1ffU);
  (ctx->reg).sharp.reg83 =
       (anon_struct_4_3_f95e0f05_for_reg83)
       ((local_198[6] & 0x1ff) << 0x10 | (uint)aVar103 & 0xfe00fe00 | local_178[6] & 0x1ff);
  (ctx->reg).sharp.reg84 =
       (anon_struct_4_3_f95e166a_for_reg84)
       ((local_1d8[6] & 0x1ff) << 0x10 | (uint)aVar104 & 0xfe00fe00 | local_1b8[6] & 0x1ff);
  (ctx->reg).sharp.reg85 =
       (anon_struct_4_3_4f125fe9_for_reg85)
       ((local_278[6] & 0xfff) << 0x10 | (uint)aVar105 & 0xf000f000 | local_258[6] & 0xfff);
  (ctx->reg).sharp.reg86 =
       (anon_struct_4_3_4f126f0b_for_reg86)
       ((local_1f8[6] & 0xfff) << 0x10 |
       (uint)(ctx->reg).sharp.reg86 & 0xf000f000 | local_298[6] & 0xfff);
  (ctx->reg).sharp.reg87 =
       (anon_struct_4_2_9a7c7d81_for_reg87)
       ((local_238[6] & 0xfff) << 0xc |
       local_218[6] & 0xfff | (uint)(byte)(ctx->reg).sharp.reg87.field_0x3 << 0x18);
  aVar13 = (ctx->reg).sharp.reg2;
  uVar129 = (src_params->shp_params).peaking_filt_core_V0[0] & 0xf;
  (ctx->reg).sharp.reg2 = (anon_struct_4_6_fef62f20_for_reg2)((uint)aVar13 & 0xfffffff0 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_filt_core_V0[1] & 0xfU) << 4;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)((uint)aVar13 & 0xffffff00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).peaking_filt_core_V0[2] & 0xfU) << 8;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)((uint)aVar13 & 0xfffff000 | uVar129 | uVar132 | uVar147);
  uVar146 = ((src_params->shp_params).peaking_filt_core_V1[0] & 0xfU) << 0xc;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)
       ((uint)aVar13 & 0xffff0000 | uVar129 | uVar132 | uVar147 | uVar146);
  uVar128 = ((src_params->shp_params).peaking_filt_core_V1[1] & 0xfU) << 0x10;
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)
       ((uint)aVar13 & 0xfff00000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128);
  (ctx->reg).sharp.reg2 =
       (anon_struct_4_6_fef62f20_for_reg2)
       ((uint)aVar13 & 0xff000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 |
       ((src_params->shp_params).peaking_filt_core_V1[2] & 0xfU) << 0x14);
  aVar14 = (ctx->reg).sharp.reg3;
  uVar129 = (src_params->shp_params).peaking_filt_core_V2[0] & 0xf;
  (ctx->reg).sharp.reg3 = (anon_struct_4_7_566f0ca7_for_reg3)((uint)aVar14 & 0xfffffff0 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_filt_core_V2[1] & 0xfU) << 4;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)((uint)aVar14 & 0xffffff00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).peaking_filt_core_V2[2] & 0xfU) << 8;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)((uint)aVar14 & 0xfffff000 | uVar129 | uVar132 | uVar147);
  uVar146 = ((src_params->shp_params).peaking_filt_core_USM[0] & 0xfU) << 0xc;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar14 & 0xffff0000 | uVar129 | uVar132 | uVar147 | uVar146);
  uVar128 = ((src_params->shp_params).peaking_filt_core_USM[1] & 0xfU) << 0x10;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar14 & 0xfff00000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128);
  uVar133 = ((src_params->shp_params).peaking_filt_core_USM[2] & 0xfU) << 0x14;
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar14 & 0xff000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 | uVar133);
  (ctx->reg).sharp.reg3 =
       (anon_struct_4_7_566f0ca7_for_reg3)
       ((uint)aVar14 & 0xf8000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 | uVar133 |
       ((src_params->shp_params).peaking_filter_cfg_diag_enh_coef & 7U) << 0x18);
  aVar15 = (ctx->reg).sharp.reg4;
  uVar129 = (src_params->shp_params).peaking_filt_core_H0[0] & 0x3f;
  (ctx->reg).sharp.reg4 = (anon_struct_4_5_5206536f_for_reg4)((uint)aVar15 & 0xffffffc0 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_filt_core_H0[1] & 0x3fU) << 8;
  (ctx->reg).sharp.reg4 =
       (anon_struct_4_5_5206536f_for_reg4)((uint)aVar15 & 0xffffc0c0 | uVar129 | uVar132);
  (ctx->reg).sharp.reg4 =
       (anon_struct_4_5_5206536f_for_reg4)
       ((uint)aVar15 & 0xffc0c0c0 | uVar129 | uVar132 |
       ((src_params->shp_params).peaking_filt_core_H0[2] & 0x3fU) << 0x10);
  aVar16 = (ctx->reg).sharp.reg6;
  uVar129 = (src_params->shp_params).peaking_filt_core_H1[0] & 0x3f;
  (ctx->reg).sharp.reg6 = (anon_struct_4_5_5206cbae_for_reg6)((uint)aVar16 & 0xffffffc0 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_filt_core_H1[1] & 0x3fU) << 8;
  (ctx->reg).sharp.reg6 =
       (anon_struct_4_5_5206cbae_for_reg6)((uint)aVar16 & 0xffffc0c0 | uVar129 | uVar132);
  (ctx->reg).sharp.reg6 =
       (anon_struct_4_5_5206cbae_for_reg6)
       ((uint)aVar16 & 0xffc0c0c0 | uVar129 | uVar132 |
       ((src_params->shp_params).peaking_filt_core_H1[2] & 0x3fU) << 0x10);
  aVar17 = (ctx->reg).sharp.reg8;
  uVar129 = (src_params->shp_params).peaking_filt_core_H2[0] & 0x3f;
  (ctx->reg).sharp.reg8 = (anon_struct_4_5_520743ed_for_reg8)((uint)aVar17 & 0xffffffc0 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_filt_core_H2[1] & 0x3fU) << 8;
  (ctx->reg).sharp.reg8 =
       (anon_struct_4_5_520743ed_for_reg8)((uint)aVar17 & 0xffffc0c0 | uVar129 | uVar132);
  (ctx->reg).sharp.reg8 =
       (anon_struct_4_5_520743ed_for_reg8)
       ((uint)aVar17 & 0xffc0c0c0 | uVar129 | uVar132 |
       ((src_params->shp_params).peaking_filt_core_H2[2] & 0x3fU) << 0x10);
  uVar129 = (src_params->shp_params).peaking_gain & 0x3ff;
  aVar18 = (ctx->reg).sharp.reg100;
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)((uint)aVar18 & 0xfffffc00 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_edge_ctrl_non_dir_thr & 0x7fU) << 0xc;
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)((uint)aVar18 & 0xfff80c00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).peaking_edge_ctrl_dir_cmp_ratio & 0xfU) << 0x14;
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)
       ((uint)aVar18 & 0xff080c00 | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg100 =
       (anon_struct_4_6_6b67bfe3_for_reg100)
       ((uint)aVar18 & 0xe0080c00 | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).peaking_edge_ctrl_non_dir_wgt_ratio & 0x1fU) << 0x18);
  aVar58._1_3_ = SUB43((ctx->reg).sharp.reg101,1);
  aVar58._0_1_ = (char)(src_params->shp_params).peaking_edge_ctrl_non_dir_wgt_offset;
  (ctx->reg).sharp.reg101 = aVar58;
  uVar129 = ((src_params->shp_params).peaking_edge_ctrl_dir_cnt_thr & 0xfU) << 8;
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)((uint)aVar58 & 0xfffff0ff | uVar129);
  uVar132 = ((src_params->shp_params).peaking_edge_ctrl_dir_cnt_avg & 7U) << 0xc;
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)((uint)aVar58 & 0xffff80ff | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).peaking_edge_ctrl_dir_cnt_offset & 0xfU) << 0x10;
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)
       ((uint)aVar58 & 0xfff080ff | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg101 =
       (anon_struct_4_6_05954ecb_for_reg101)
       ((uint)aVar58 & 0xf80080ff | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).peaking_edge_ctrl_diag_dir_thr & 0x7fU) << 0x14);
  aVar19 = (ctx->reg).sharp.reg102;
  uVar133 = (src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[0] & 0xf;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)((uint)aVar19 & 0xfffffff0 | uVar133);
  uVar134 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[1] & 0xfU) << 4;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)((uint)aVar19 & 0xffffff00 | uVar133 | uVar134);
  uVar129 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[2] & 0xfU) << 8;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar19 & 0xfffff000 | uVar133 | uVar134 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[3] & 0xfU) << 0xc;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar19 & 0xffff0000 | uVar133 | uVar134 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[4] & 0xfU) << 0x10;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar19 & 0xfff00000 | uVar133 | uVar134 | uVar129 | uVar132 | uVar147);
  uVar146 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[5] & 0xfU) << 0x14;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar19 & 0xff000000 | uVar133 | uVar134 | uVar129 | uVar132 | uVar147 | uVar146);
  uVar128 = ((src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[6] & 0xfU) << 0x18;
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       ((uint)aVar19 & 0xf0000000 | uVar133 | uVar134 | uVar129 | uVar132 | uVar147 | uVar146 |
       uVar128);
  (ctx->reg).sharp.reg102 =
       (anon_struct_4_8_1448ed05_for_reg102)
       (uVar133 | uVar134 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 |
       (src_params->shp_params).peaking_edge_ctrl_diag_adj_gain_tab[7] << 0x1c);
  aVar20 = (ctx->reg).sharp.reg103;
  uVar129 = (src_params->shp_params).peaking_estc_alpha_over_non & 0x7f;
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)((uint)aVar20 & 0xffffff80 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_estc_alpha_under_non & 0x7fU) << 8;
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)((uint)aVar20 & 0xffff8080 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_non & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)
       ((uint)aVar20 & 0xff808080 | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg103 =
       (anon_struct_4_7_51a04710_for_reg103)
       ((uint)aVar20 & 0x80808080 | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_non & 0x7fU) << 0x18);
  aVar21 = (ctx->reg).sharp.reg104;
  uVar129 = (src_params->shp_params).peaking_estc_alpha_over_v & 0x7f;
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)((uint)aVar21 & 0xffffff80 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_estc_alpha_under_v & 0x7fU) << 8;
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)((uint)aVar21 & 0xffff8080 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_v & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)
       ((uint)aVar21 & 0xff808080 | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg104 =
       (anon_struct_4_7_f4a15204_for_reg104)
       ((uint)aVar21 & 0x80808080 | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_v & 0x7fU) << 0x18);
  aVar22 = (ctx->reg).sharp.reg105;
  uVar129 = (src_params->shp_params).peaking_estc_alpha_over_h & 0x7f;
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)((uint)aVar22 & 0xffffff80 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_estc_alpha_under_h & 0x7fU) << 8;
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)((uint)aVar22 & 0xffff8080 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_h & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)
       ((uint)aVar22 & 0xff808080 | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg105 =
       (anon_struct_4_7_13dfdf50_for_reg105)
       ((uint)aVar22 & 0x80808080 | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_h & 0x7fU) << 0x18);
  aVar23 = (ctx->reg).sharp.reg106;
  uVar129 = (src_params->shp_params).peaking_estc_alpha_over_d0 & 0x7f;
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)((uint)aVar23 & 0xffffff80 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_estc_alpha_under_d0 & 0x7fU) << 8;
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)((uint)aVar23 & 0xffff8080 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_d0 & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)
       ((uint)aVar23 & 0xff808080 | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg106 =
       (anon_struct_4_7_15216c04_for_reg106)
       ((uint)aVar23 & 0x80808080 | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_d0 & 0x7fU) << 0x18);
  aVar24 = (ctx->reg).sharp.reg107;
  uVar129 = (src_params->shp_params).peaking_estc_alpha_over_d1 & 0x7f;
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)((uint)aVar24 & 0xffffff80 | uVar129);
  uVar132 = ((src_params->shp_params).peaking_estc_alpha_under_d1 & 0x7fU) << 8;
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)((uint)aVar24 & 0xffff8080 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).peaking_estc_alpha_over_unlimit_d1 & 0x7fU) << 0x10;
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)
       ((uint)aVar24 & 0xff808080 | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg107 =
       (anon_struct_4_7_1521e444_for_reg107)
       ((uint)aVar24 & 0x80808080 | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).peaking_estc_alpha_under_unlimit_d1 & 0x7fU) << 0x18);
  aVar59._1_3_ = SUB43((ctx->reg).sharp.reg108,1);
  aVar59._0_1_ = (char)(src_params->shp_params).peaking_estc_delta_offset_non;
  (ctx->reg).sharp.reg108 = aVar59;
  uVar129 = ((src_params->shp_params).peaking_estc_delta_offset_v & 0xffU) << 8;
  (ctx->reg).sharp.reg108 =
       (anon_struct_4_3_724851b1_for_reg108)((uint)aVar59 & 0xffff00ff | uVar129);
  (ctx->reg).sharp.reg108 =
       (anon_struct_4_3_724851b1_for_reg108)
       ((uint)aVar59 & 0xff0000ff | uVar129 |
       ((src_params->shp_params).peaking_estc_delta_offset_h & 0xffU) << 0x10);
  RVar25 = (src_params->shp_params).peaking_estc_delta_offset_d0;
  *(char *)&(ctx->reg).sharp.reg109 = (char)RVar25;
  *(ushort *)&(ctx->reg).sharp.reg109 =
       (ushort)((src_params->shp_params).peaking_estc_delta_offset_d1 << 8) | (ushort)RVar25 & 0xff;
  aVar26 = (ctx->reg).sharp.reg110;
  uVar129 = (src_params->shp_params).shootctrl_filter_radius & 1;
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)((uint)aVar26 & 0xfffffffe | uVar129);
  uVar132 = ((src_params->shp_params).shootctrl_delta_offset & 0xffU) << 4;
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)((uint)aVar26 & 0xfffff00e | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).shootctrl_alpha_over & 0x7fU) << 0xc;
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)
       ((uint)aVar26 & 0xfff8000e | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg110 =
       (anon_struct_4_6_98c00d60_for_reg110)
       ((uint)aVar26 & 0xf808000e | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).shootctrl_alpha_under & 0x7fU) << 0x14);
  uVar142 = (ushort)(src_params->shp_params).shootctrl_alpha_over_unlimit & 0x7f;
  uVar131 = SUB42((ctx->reg).sharp.reg111,0);
  *(ushort *)&(ctx->reg).sharp.reg111 = uVar131 & 0xff80 | uVar142;
  *(ushort *)&(ctx->reg).sharp.reg111 =
       uVar131 & 0x8080 | uVar142 |
       (ushort)(((src_params->shp_params).shootctrl_alpha_under_unlimit & 0x7fU) << 8);
  uVar133 = (uint)(src_params->shp_params).global_gain_adp_grd[1] >> 2 & 0xff;
  aVar27 = (ctx->reg).sharp.reg112;
  (ctx->reg).sharp.reg112 =
       (anon_struct_4_5_4e72b6e0_for_reg112)((uint)aVar27 & 0xffffff00 | uVar133);
  uVar129 = (src_params->shp_params).global_gain_adp_grd[2];
  uVar147 = (uVar129 & 0x3fc) << 8;
  (ctx->reg).sharp.reg112 =
       (anon_struct_4_5_4e72b6e0_for_reg112)((uint)aVar27 & 0xfffc0300 | uVar133 | uVar147);
  uVar132 = (src_params->shp_params).global_gain_adp_grd[3];
  (ctx->reg).sharp.reg112 =
       (anon_struct_4_5_4e72b6e0_for_reg112)
       ((uint)aVar27 & 0xf00c0300 | uVar133 | uVar147 | (uVar132 & 0x3fc) << 0x12);
  uVar147 = (uint)(src_params->shp_params).global_gain_adp_grd[4] >> 2 & 0xff;
  aVar28 = (ctx->reg).sharp.reg113;
  (ctx->reg).sharp.reg113 =
       (anon_struct_4_5_de9b1aa1_for_reg113)((uint)aVar28 & 0xffffff00 | uVar147);
  uVar128 = (src_params->shp_params).global_gain_adp_val[0] & 0x7f;
  uVar146 = uVar128 << 0xc;
  (ctx->reg).sharp.reg113 =
       (anon_struct_4_5_de9b1aa1_for_reg113)((uint)aVar28 & 0xfff80f00 | uVar147 | uVar146);
  uVar160 = (src_params->shp_params).global_gain_adp_val[1] & 0x7f;
  (ctx->reg).sharp.reg113 =
       (anon_struct_4_5_de9b1aa1_for_reg113)
       ((uint)aVar28 & 0xf8080f00 | uVar147 | uVar146 | uVar160 << 0x14);
  uVar134 = (src_params->shp_params).global_gain_adp_val[2] & 0x7f;
  aVar29 = (ctx->reg).sharp.reg114;
  (ctx->reg).sharp.reg114 =
       (anon_struct_4_5_8d760384_for_reg114)((uint)aVar29 & 0xffffff80 | uVar134);
  uVar138 = (src_params->shp_params).global_gain_adp_val[3] & 0x7f;
  (ctx->reg).sharp.reg114 =
       (anon_struct_4_5_8d760384_for_reg114)((uint)aVar29 & 0xffff8080 | uVar134 | uVar138 << 8);
  uVar146 = (src_params->shp_params).global_gain_adp_val[4] & 0x7f;
  fVar180 = ((float)(int)(uVar160 - uVar128) * 128.0) / (float)(uVar133 + (uVar133 == 0));
  (ctx->reg).sharp.reg114 =
       (anon_struct_4_5_8d760384_for_reg114)
       ((uint)aVar29 & 0xff808080 | uVar134 | uVar138 << 8 | uVar146 << 0x10);
  fVar169 = 0.5;
  fVar172 = 0.5;
  if (fVar180 <= 0.0) {
    fVar172 = -0.5;
  }
  uVar129 = uVar129 >> 2 & 0xff;
  iVar150 = uVar129 - uVar133;
  if (iVar150 < 2) {
    iVar150 = 1;
  }
  fVar190 = ((float)(int)(uVar134 - uVar160) * 128.0) / (float)iVar150;
  fVar178 = 0.5;
  if (fVar190 <= 0.0) {
    fVar178 = -0.5;
  }
  uVar132 = uVar132 >> 2 & 0xff;
  iVar150 = uVar132 - uVar129;
  if (iVar150 < 2) {
    iVar150 = 1;
  }
  fVar181 = ((float)(int)(uVar138 - uVar134) * 128.0) / (float)iVar150;
  fVar212 = 0.5;
  if (fVar181 <= 0.0) {
    fVar212 = -0.5;
  }
  iVar150 = uVar147 - uVar132;
  if (iVar150 < 2) {
    iVar150 = 1;
  }
  fVar195 = ((float)(int)(uVar146 - uVar138) * 128.0) / (float)iVar150;
  fVar65 = 0.5;
  if (fVar195 <= 0.0) {
    fVar65 = -0.5;
  }
  uVar129 = (uint)(fVar172 + fVar180);
  uVar128 = (uint)(fVar178 + fVar190);
  uVar132 = (uint)(fVar212 + fVar181);
  uVar133 = (uint)(fVar65 + fVar195);
  fVar180 = ((float)(int)((src_params->shp_params).global_gain_adp_val[5] - uVar146) * 128.0) /
            (float)((uVar147 ^ 0xff) + (uint)((uVar147 ^ 0xff) == 0));
  fVar172 = 0.5;
  if (fVar180 <= 0.0) {
    fVar172 = -0.5;
  }
  uVar147 = (uint)(fVar172 + fVar180);
  if (0x3fe < (int)uVar129) {
    uVar129 = 0x3ff;
  }
  if ((int)uVar129 < -0x3ff) {
    uVar129 = 0xfffffc00;
  }
  if (0x3fe < (int)uVar128) {
    uVar128 = 0x3ff;
  }
  if ((int)uVar128 < -0x3ff) {
    uVar128 = 0xfffffc00;
  }
  if (0x3fe < (int)uVar132) {
    uVar132 = 0x3ff;
  }
  if ((int)uVar132 < -0x3ff) {
    uVar132 = 0xfffffc00;
  }
  (ctx->reg).sharp.reg115 =
       (anon_struct_4_3_f9f4ffc9_for_reg115)
       ((uVar128 & 0x7ff) << 0xc | (uint)(ctx->reg).sharp.reg115 & 0xff800800 | uVar129 & 0x7ff);
  if (0x3fe < (int)uVar133) {
    uVar133 = 0x3ff;
  }
  if ((int)uVar133 < -0x3ff) {
    uVar133 = 0xfffffc00;
  }
  (ctx->reg).sharp.reg128 =
       (anon_struct_4_3_f9f507c9_for_reg128)
       ((uVar133 & 0x7ff) << 0xc | (uint)(ctx->reg).sharp.reg128 & 0xff800800 | uVar132 & 0x7ff);
  if (0x3fe < (int)uVar147) {
    uVar147 = 0x3ff;
  }
  if ((int)uVar147 < -0x3ff) {
    uVar147 = 0xfffffc00;
  }
  uVar147 = uVar147 & 0x7ff;
  aVar30 = (ctx->reg).sharp.reg129;
  (ctx->reg).sharp.reg129 =
       (anon_struct_4_4_9babbec2_for_reg129)((uint)aVar30 & 0xfffff800 | uVar147);
  uVar129 = (src_params->shp_params).global_gain_var_grd[1];
  uVar146 = (uVar129 & 0x3fc) << 9;
  (ctx->reg).sharp.reg129 =
       (anon_struct_4_4_9babbec2_for_reg129)((uint)aVar30 & 0xfff80000 | uVar147 | uVar146);
  uVar132 = (src_params->shp_params).global_gain_var_grd[2];
  (ctx->reg).sharp.reg129 =
       (anon_struct_4_4_9babbec2_for_reg129)
       ((uint)aVar30 & 0xe0180000 | uVar147 | uVar146 | (uVar132 & 0x3fc) << 0x13);
  uVar146 = (uint)(src_params->shp_params).global_gain_var_grd[3] >> 2 & 0xff;
  aVar31 = (ctx->reg).sharp.reg130;
  (ctx->reg).sharp.reg130 =
       (anon_struct_4_5_7a7ec4dc_for_reg130)((uint)aVar31 & 0xffffff00 | uVar146);
  uVar147 = (src_params->shp_params).global_gain_var_grd[4];
  uVar128 = (uVar147 & 0x3fc) << 10;
  (ctx->reg).sharp.reg130 =
       (anon_struct_4_5_7a7ec4dc_for_reg130)((uint)aVar31 & 0xfff00f00 | uVar146 | uVar128);
  uVar159 = (src_params->shp_params).global_gain_var_val[0] & 0x7f;
  (ctx->reg).sharp.reg130 =
       (anon_struct_4_5_7a7ec4dc_for_reg130)
       ((uint)aVar31 & 0x80f00f00 | uVar146 | uVar128 | uVar159 << 0x18);
  aVar32 = (ctx->reg).sharp.reg131;
  uVar161 = (src_params->shp_params).global_gain_var_val[1] & 0x7f;
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)((uint)aVar32 & 0xffffff80 | uVar161);
  uVar128 = (src_params->shp_params).global_gain_var_val[2] & 0x7f;
  uVar134 = uVar128 << 8;
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)((uint)aVar32 & 0xffff8080 | uVar161 | uVar134);
  uVar138 = (src_params->shp_params).global_gain_var_val[3] & 0x7f;
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)
       ((uint)aVar32 & 0xff808080 | uVar161 | uVar134 | uVar138 << 0x10);
  uVar160 = (src_params->shp_params).global_gain_var_val[4] & 0x7f;
  uVar133 = uVar129 >> 2 & 0xff;
  iVar162 = uVar133 + (uVar133 == 0);
  uVar132 = uVar132 >> 2 & 0xff;
  uVar129 = uVar146 - uVar132;
  iVar150 = uVar132 - uVar133;
  if (iVar150 < 2) {
    iVar150 = 1;
  }
  if ((int)uVar129 < 2) {
    uVar129 = 1;
  }
  (ctx->reg).sharp.reg131 =
       (anon_struct_4_7_35acda4c_for_reg131)
       ((uint)aVar32 & 0x80808080 | uVar161 | uVar134 | uVar138 << 0x10 | uVar160 << 0x18);
  uVar132 = uVar147 >> 2 & 0xff;
  uVar146 = uVar132 - uVar146;
  if ((int)uVar146 < 2) {
    uVar146 = 1;
  }
  uVar132 = uVar132 ^ 0xff;
  fVar180 = ((float)(int)((src_params->shp_params).global_gain_var_val[5] - uVar160) * 128.0) /
            (float)(uVar132 + (uVar132 == 0));
  fVar172 = 0.5;
  if (fVar180 <= 0.0) {
    fVar172 = -0.5;
  }
  uVar132 = (uint)(fVar172 + fVar180);
  fVar172 = (float)(int)(uVar161 - uVar159) * 128.0;
  fVar178 = (float)(int)(uVar138 - uVar128) * 128.0;
  auVar196._4_4_ = uVar129;
  auVar196._0_4_ = iVar162;
  auVar196._8_8_ = 0;
  auVar187._0_4_ = (float)iVar162;
  auVar187._4_4_ = (float)(int)uVar129;
  auVar187._8_8_ = 0;
  auVar176 = rcpps(auVar196,auVar187);
  fVar180 = fVar172 * auVar176._0_4_;
  fVar190 = fVar178 * auVar176._4_4_;
  fVar180 = (fVar172 - auVar187._0_4_ * fVar180) * auVar176._0_4_ + fVar180;
  fVar190 = (fVar178 - auVar187._4_4_ * fVar190) * auVar176._4_4_ + fVar190;
  uVar129 = -(uint)(0.0 < fVar180);
  uVar147 = -(uint)(0.0 < fVar190);
  auVar111._4_8_ = 0;
  auVar111._0_4_ = uVar129 & 0x3fe00000;
  auVar208._0_12_ = auVar111 << 0x20;
  auVar208._12_4_ = uVar147 & 0x3fe00000;
  auVar112._4_8_ = 0;
  auVar112._0_4_ = ~uVar129 & 0xbfe00000;
  auVar197._0_12_ = auVar112 << 0x20;
  auVar197._12_4_ = ~uVar147 & 0xbfe00000;
  uVar133 = (uint)(SUB168(auVar197 | auVar208,0) + (double)fVar180);
  uVar134 = (uint)(SUB168(auVar197 | auVar208,8) + (double)fVar190);
  fVar172 = (float)(int)(uVar128 - uVar161) * 128.0;
  fVar178 = (float)(int)(uVar160 - uVar138) * 128.0;
  auVar193._0_4_ = (float)iVar150;
  auVar193._4_4_ = (float)(int)uVar146;
  auVar193._8_8_ = 0;
  auVar176 = rcpps(ZEXT416(uVar146),auVar193);
  fVar180 = fVar172 * auVar176._0_4_;
  fVar190 = fVar178 * auVar176._4_4_;
  fVar180 = (fVar172 - auVar193._0_4_ * fVar180) * auVar176._0_4_ + fVar180;
  fVar190 = (fVar178 - auVar193._4_4_ * fVar190) * auVar176._4_4_ + fVar190;
  uVar129 = -(uint)(0.0 < fVar180);
  uVar147 = -(uint)(0.0 < fVar190);
  auVar113._4_8_ = 0;
  auVar113._0_4_ = uVar129 & 0x3fe00000;
  auVar203._0_12_ = auVar113 << 0x20;
  auVar203._12_4_ = uVar147 & 0x3fe00000;
  auVar114._4_8_ = 0;
  auVar114._0_4_ = ~uVar129 & 0xbfe00000;
  auVar194._0_12_ = auVar114 << 0x20;
  auVar194._12_4_ = ~uVar147 & 0xbfe00000;
  uVar138 = (uint)(SUB168(auVar194 | auVar203,0) + (double)fVar180);
  uVar160 = (uint)(SUB168(auVar194 | auVar203,8) + (double)fVar190);
  uVar129 = -(uint)((int)uVar133 < 0x3ff);
  uVar147 = -(uint)((int)uVar134 < 0x3ff);
  uVar133 = ~uVar129 & 0x3ff | uVar133 & uVar129;
  uVar134 = ~uVar147 & 0x3ff | uVar134 & uVar147;
  uVar129 = -(uint)(-0x400 < (int)uVar133);
  uVar146 = -(uint)(-0x400 < (int)uVar134);
  aVar107 = (ctx->reg).sharp.reg133;
  uVar147 = -(uint)((int)uVar138 < 0x3ff);
  uVar128 = -(uint)((int)uVar160 < 0x3ff);
  uVar147 = ~uVar147 & 0x3ff | uVar138 & uVar147;
  uVar128 = ~uVar128 & 0x3ff | uVar160 & uVar128;
  uVar138 = -(uint)(-0x400 < (int)uVar147);
  uVar160 = -(uint)(-0x400 < (int)uVar128);
  (ctx->reg).sharp.reg132 =
       (anon_struct_4_3_72b65f09_for_reg132)
       (((~uVar138 & 0xfffffc00 | uVar147 & uVar138) & 0x7ff) << 0xc |
       (uint)(ctx->reg).sharp.reg132 & 0xff800800 |
       (~uVar129 & 0xfffffc00 | uVar133 & uVar129) & 0x7ff);
  (ctx->reg).sharp.reg133 =
       (anon_struct_4_3_72b66709_for_reg133)
       (((~uVar160 & 0xfffffc00 | uVar128 & uVar160) & 0x7ff) << 0xc |
       (uint)aVar107 & 0xff800800 | (~uVar146 & 0xfffffc00 | uVar134 & uVar146) & 0x7ff);
  if (0x3fe < (int)uVar132) {
    uVar132 = 0x3ff;
  }
  if ((int)uVar132 < -0x3ff) {
    uVar132 = 0xfffffc00;
  }
  aVar33 = (ctx->reg).sharp.reg134;
  uVar132 = uVar132 & 0x7ff;
  (ctx->reg).sharp.reg134 =
       (anon_struct_4_5_713fce19_for_reg134)((uint)aVar33 & 0xfffff800 | uVar132);
  uVar147 = ((src_params->shp_params).global_gain_lum_mode & 3U) << 0x10;
  (ctx->reg).sharp.reg134 =
       (anon_struct_4_5_713fce19_for_reg134)((uint)aVar33 & 0xfffcf800 | uVar132 | uVar147);
  uVar129 = (src_params->shp_params).global_gain_lum_grd[1];
  (ctx->reg).sharp.reg134 =
       (anon_struct_4_5_713fce19_for_reg134)
       ((uint)aVar33 & 0xf00cf800 | uVar132 | uVar147 | (uVar129 & 0x3fc) << 0x12);
  uVar138 = (uint)(src_params->shp_params).global_gain_lum_grd[2] >> 2 & 0xff;
  aVar34 = (ctx->reg).sharp.reg135;
  (ctx->reg).sharp.reg135 =
       (anon_struct_4_5_098cd0aa_for_reg135)((uint)aVar34 & 0xffffff00 | uVar138);
  uVar132 = (src_params->shp_params).global_gain_lum_grd[3];
  uVar146 = (uVar132 & 0x3fc) << 8;
  (ctx->reg).sharp.reg135 =
       (anon_struct_4_5_098cd0aa_for_reg135)((uint)aVar34 & 0xfffc0300 | uVar138 | uVar146);
  uVar147 = (src_params->shp_params).global_gain_lum_grd[4];
  (ctx->reg).sharp.reg135 =
       (anon_struct_4_5_098cd0aa_for_reg135)
       ((uint)aVar34 & 0xf00c0300 | uVar138 | uVar146 | (uVar147 & 0x3fc) << 0x12);
  aVar35 = (ctx->reg).sharp.reg136;
  uVar133 = (src_params->shp_params).global_gain_lum_val[0] & 0x7f;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)((uint)aVar35 & 0xffffff80 | uVar133);
  uVar134 = (src_params->shp_params).global_gain_lum_val[1] & 0x7f;
  uVar146 = uVar134 << 8;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)((uint)aVar35 & 0xffff8080 | uVar133 | uVar146);
  uVar128 = (src_params->shp_params).global_gain_lum_val[2] & 0x7f;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)
       ((uint)aVar35 & 0xff808080 | uVar133 | uVar146 | uVar128 << 0x10);
  uVar160 = (src_params->shp_params).global_gain_lum_val[3] & 0x7f;
  (ctx->reg).sharp.reg136 =
       (anon_struct_4_7_7222c14c_for_reg136)
       ((uint)aVar35 & 0x80808080 | uVar133 | uVar146 | uVar128 << 0x10 | uVar160 << 0x18);
  uVar146 = (src_params->shp_params).global_gain_lum_val[4] & 0x7f;
  aVar143 = (anon_struct_4_5_4b644edc_for_reg137)
            ((uint)(ctx->reg).sharp.reg137 & 0xffffff80 | uVar146);
  uVar129 = uVar129 >> 2 & 0xff;
  (ctx->reg).sharp.reg137 = aVar143;
  fVar180 = ((float)(int)(uVar134 - uVar133) * 128.0) / (float)(uVar129 + (uVar129 == 0));
  fVar172 = 0.5;
  if (fVar180 <= 0.0) {
    fVar172 = -0.5;
  }
  iVar150 = uVar138 - uVar129;
  if ((int)(uVar138 - uVar129) < 2) {
    iVar150 = 1;
  }
  uVar129 = uVar132 >> 2 & 0xff;
  iVar162 = uVar129 - uVar138;
  if (iVar162 < 2) {
    iVar162 = 1;
  }
  fVar190 = ((float)(int)(uVar160 - uVar128) * 128.0) / (float)iVar162;
  fVar178 = 0.5;
  if (fVar190 <= 0.0) {
    fVar178 = -0.5;
  }
  iVar151 = (int)(fVar172 + fVar180);
  iVar141 = (int)(fVar178 + fVar190);
  uVar132 = uVar147 >> 2 & 0xff;
  iVar162 = uVar132 - uVar129;
  if (iVar162 < 2) {
    iVar162 = 1;
  }
  uVar132 = uVar132 ^ 0xff;
  fVar180 = ((float)(int)((src_params->shp_params).global_gain_lum_val[5] - uVar146) * 128.0) /
            (float)(uVar132 + (uVar132 == 0));
  fVar172 = 0.5;
  if (fVar180 <= 0.0) {
    fVar172 = -0.5;
  }
  if (0x3fe < iVar151) {
    iVar151 = 0x3ff;
  }
  iVar145 = (int)(fVar172 + fVar180);
  if (iVar151 < -0x3ff) {
    iVar151 = -0x400;
  }
  if (0x3fe < iVar141) {
    iVar141 = 0x3ff;
  }
  iVar144 = -0x400;
  if (iVar141 < -0x3ff) {
    iVar141 = iVar144;
  }
  fVar172 = (float)(int)(uVar128 - uVar134) * 128.0;
  fVar178 = (float)(int)(uVar146 - uVar160) * 128.0;
  auVar204._4_4_ = iVar162;
  auVar204._0_4_ = iVar150;
  auVar204._8_8_ = 0;
  auVar198._0_4_ = (float)iVar150;
  auVar198._4_4_ = (float)iVar162;
  auVar198._8_8_ = 0;
  auVar176 = rcpps(auVar204,auVar198);
  fVar180 = fVar172 * auVar176._0_4_;
  fVar190 = fVar178 * auVar176._4_4_;
  fVar180 = (fVar172 - auVar198._0_4_ * fVar180) * auVar176._0_4_ + fVar180;
  fVar190 = (fVar178 - auVar198._4_4_ * fVar190) * auVar176._4_4_ + fVar190;
  uVar129 = -(uint)(0.0 < fVar180);
  uVar132 = -(uint)(0.0 < fVar190);
  auVar115._4_8_ = 0;
  auVar115._0_4_ = uVar129 & 0x3fe00000;
  auVar211._0_12_ = auVar115 << 0x20;
  auVar211._12_4_ = uVar132 & 0x3fe00000;
  auVar116._4_8_ = 0;
  auVar116._0_4_ = ~uVar129 & 0xbfe00000;
  auVar199._0_12_ = auVar116 << 0x20;
  auVar199._12_4_ = ~uVar132 & 0xbfe00000;
  uVar129 = (uint)(SUB168(auVar199 | auVar211,0) + (double)fVar180);
  uVar132 = (uint)(SUB168(auVar199 | auVar211,8) + (double)fVar190);
  uVar147 = -(uint)((int)uVar129 < 0x3ff);
  uVar146 = -(uint)((int)uVar132 < 0x3ff);
  uVar147 = ~uVar147 & 0x3ff | uVar129 & uVar147;
  uVar146 = ~uVar146 & 0x3ff | uVar132 & uVar146;
  uVar129 = -(uint)(-0x400 < (int)uVar147);
  uVar132 = -(uint)(-0x400 < (int)uVar146);
  if (0x3fe < iVar145) {
    iVar145 = 0x3ff;
  }
  uVar200 = CONCAT44((~uVar132 & 0xfffffc00 | uVar146 & uVar132) << 0xc,
                     (~uVar129 & 0xfffffc00 | uVar147 & uVar129) << 0x14) & (ulong)DAT_001534f0 |
            CONCAT44((ctx->reg).sharp.reg138,aVar143) & (ulong)DAT_001534e0 |
            CONCAT44(iVar141,iVar151 << 8) & (ulong)DAT_001534d0;
  if (iVar145 < -0x3ff) {
    iVar145 = iVar144;
  }
  (ctx->reg).sharp.reg137 = (anon_struct_4_5_4b644edc_for_reg137)(int)uVar200;
  (ctx->reg).sharp.reg138 = (anon_struct_4_3_c036caa9_for_reg138)(int)(uVar200 >> 0x20);
  *(ushort *)&(ctx->reg).sharp.reg139 =
       *(ushort *)&(ctx->reg).sharp.reg139 & 0xf800 | (ushort)iVar145 & 0x7ff;
  aVar60._1_3_ = SUB43((ctx->reg).sharp.reg140,1);
  aVar60._0_1_ = (char)(src_params->shp_params).color_ctrl_p0_point_u;
  (ctx->reg).sharp.reg140 = aVar60;
  uVar129 = ((src_params->shp_params).color_ctrl_p0_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg140 =
       (anon_struct_4_5_7839e156_for_reg140)((uint)aVar60 & 0xfff00fff | uVar129);
  (ctx->reg).sharp.reg140 =
       (anon_struct_4_5_7839e156_for_reg140)
       ((uint)aVar60 & 0xf8f00fff | uVar129 |
       ((src_params->shp_params).color_ctrl_p0_scaling_coef & 7U) << 0x18);
  aVar36 = (ctx->reg).sharp.reg141;
  uVar129 = (src_params->shp_params).color_ctrl_p0_roll_tab[0] & 0x1f;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)((uint)aVar36 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p0_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)((uint)aVar36 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p0_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar36 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  uVar146 = ((src_params->shp_params).color_ctrl_p0_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar36 & 0xfff00000 | uVar129 | uVar132 | uVar147 | uVar146);
  uVar128 = ((src_params->shp_params).color_ctrl_p0_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar36 & 0xfe000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128);
  (ctx->reg).sharp.reg141 =
       (anon_struct_4_6_1794af64_for_reg141)
       ((uint)aVar36 & 0xc0000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 |
       ((src_params->shp_params).color_ctrl_p0_roll_tab[5] & 0x1fU) << 0x19);
  uVar129 = (src_params->shp_params).color_ctrl_p0_roll_tab[6] & 0x1f;
  aVar37 = (ctx->reg).sharp.reg142;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)((uint)aVar37 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p0_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)((uint)aVar37 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p0_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar37 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  uVar146 = ((src_params->shp_params).color_ctrl_p0_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar37 & 0xfff00000 | uVar129 | uVar132 | uVar147 | uVar146);
  uVar128 = ((src_params->shp_params).color_ctrl_p0_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar37 & 0xfe000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128);
  (ctx->reg).sharp.reg142 =
       (anon_struct_4_6_e5dd6b84_for_reg142)
       ((uint)aVar37 & 0xc0000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 |
       ((src_params->shp_params).color_ctrl_p0_roll_tab[0xb] & 0x1fU) << 0x19);
  uVar129 = (src_params->shp_params).color_ctrl_p0_roll_tab[0xc] & 0x1f;
  aVar38 = (ctx->reg).sharp.reg143;
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)((uint)aVar38 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p0_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)((uint)aVar38 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p0_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)
       ((uint)aVar38 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg143 =
       (anon_struct_4_4_f8f30d03_for_reg143)
       ((uint)aVar38 & 0xfff00000 | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).color_ctrl_p0_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar61._1_3_ = SUB43((ctx->reg).sharp.reg144,1);
  aVar61._0_1_ = (char)(src_params->shp_params).color_ctrl_p1_point_u;
  (ctx->reg).sharp.reg144 = aVar61;
  uVar129 = ((src_params->shp_params).color_ctrl_p1_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg144 =
       (anon_struct_4_5_7839e537_for_reg144)((uint)aVar61 & 0xfff00fff | uVar129);
  (ctx->reg).sharp.reg144 =
       (anon_struct_4_5_7839e537_for_reg144)
       ((uint)aVar61 & 0xf8f00fff | uVar129 |
       ((src_params->shp_params).color_ctrl_p1_scaling_coef & 7U) << 0x18);
  uVar129 = (src_params->shp_params).color_ctrl_p1_roll_tab[0] & 0x1f;
  aVar39 = (ctx->reg).sharp.reg145;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)((uint)aVar39 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p1_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)((uint)aVar39 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p1_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar39 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  uVar146 = ((src_params->shp_params).color_ctrl_p1_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar39 & 0xfff00000 | uVar129 | uVar132 | uVar147 | uVar146);
  uVar128 = ((src_params->shp_params).color_ctrl_p1_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar39 & 0xfe000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128);
  (ctx->reg).sharp.reg145 =
       (anon_struct_4_6_b61f7fc4_for_reg145)
       ((uint)aVar39 & 0xc0000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 |
       ((src_params->shp_params).color_ctrl_p1_roll_tab[5] & 0x1fU) << 0x19);
  uVar129 = (src_params->shp_params).color_ctrl_p1_roll_tab[6] & 0x1f;
  aVar40 = (ctx->reg).sharp.reg146;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)((uint)aVar40 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p1_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)((uint)aVar40 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p1_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar40 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  uVar146 = ((src_params->shp_params).color_ctrl_p1_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar40 & 0xfff00000 | uVar129 | uVar132 | uVar147 | uVar146);
  uVar128 = ((src_params->shp_params).color_ctrl_p1_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar40 & 0xfe000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128);
  (ctx->reg).sharp.reg146 =
       (anon_struct_4_6_e3c66fa4_for_reg146)
       ((uint)aVar40 & 0xc0000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 |
       ((src_params->shp_params).color_ctrl_p1_roll_tab[0xb] & 0x1fU) << 0x19);
  uVar129 = (src_params->shp_params).color_ctrl_p1_roll_tab[0xc] & 0x1f;
  aVar41 = (ctx->reg).sharp.reg147;
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)((uint)aVar41 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p1_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)((uint)aVar41 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p1_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)
       ((uint)aVar41 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg147 =
       (anon_struct_4_4_2f9cacc3_for_reg147)
       ((uint)aVar41 & 0xfff00000 | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).color_ctrl_p1_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar62._1_3_ = SUB43((ctx->reg).sharp.reg148,1);
  aVar62._0_1_ = (char)(src_params->shp_params).color_ctrl_p2_point_u;
  (ctx->reg).sharp.reg148 = aVar62;
  uVar129 = ((src_params->shp_params).color_ctrl_p2_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg148 =
       (anon_struct_4_5_7839e918_for_reg148)((uint)aVar62 & 0xfff00fff | uVar129);
  (ctx->reg).sharp.reg148 =
       (anon_struct_4_5_7839e918_for_reg148)
       ((uint)aVar62 & 0xf8f00fff | uVar129 |
       ((src_params->shp_params).color_ctrl_p2_scaling_coef & 7U) << 0x18);
  uVar129 = (src_params->shp_params).color_ctrl_p2_roll_tab[0] & 0x1f;
  aVar42 = (ctx->reg).sharp.reg149;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)((uint)aVar42 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p2_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)((uint)aVar42 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p2_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar42 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  uVar146 = ((src_params->shp_params).color_ctrl_p2_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar42 & 0xfff00000 | uVar129 | uVar132 | uVar147 | uVar146);
  uVar128 = ((src_params->shp_params).color_ctrl_p2_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar42 & 0xfe000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128);
  (ctx->reg).sharp.reg149 =
       (anon_struct_4_6_54aa5024_for_reg149)
       ((uint)aVar42 & 0xc0000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 |
       ((src_params->shp_params).color_ctrl_p2_roll_tab[5] & 0x1fU) << 0x19);
  uVar129 = (src_params->shp_params).color_ctrl_p2_roll_tab[6] & 0x1f;
  aVar43 = (ctx->reg).sharp.reg150;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)((uint)aVar43 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p2_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)((uint)aVar43 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p2_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar43 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  uVar146 = ((src_params->shp_params).color_ctrl_p2_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar43 & 0xfff00000 | uVar129 | uVar132 | uVar147 | uVar146);
  uVar128 = ((src_params->shp_params).color_ctrl_p2_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar43 & 0xfe000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128);
  (ctx->reg).sharp.reg150 =
       (anon_struct_4_6_e1af73c4_for_reg150)
       ((uint)aVar43 & 0xc0000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 |
       ((src_params->shp_params).color_ctrl_p2_roll_tab[0xb] & 0x1fU) << 0x19);
  uVar129 = (src_params->shp_params).color_ctrl_p2_roll_tab[0xc] & 0x1f;
  aVar44 = (ctx->reg).sharp.reg151;
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)((uint)aVar44 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p2_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)((uint)aVar44 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p2_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)
       ((uint)aVar44 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg151 =
       (anon_struct_4_4_66464c83_for_reg151)
       ((uint)aVar44 & 0xfff00000 | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).color_ctrl_p2_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar63._1_3_ = SUB43((ctx->reg).sharp.reg152,1);
  aVar63._0_1_ = (char)(src_params->shp_params).color_ctrl_p3_point_u;
  (ctx->reg).sharp.reg152 = aVar63;
  uVar129 = ((src_params->shp_params).color_ctrl_p3_point_v & 0xffU) << 0xc;
  (ctx->reg).sharp.reg152 =
       (anon_struct_4_5_7839ecf9_for_reg152)((uint)aVar63 & 0xfff00fff | uVar129);
  (ctx->reg).sharp.reg152 =
       (anon_struct_4_5_7839ecf9_for_reg152)
       ((uint)aVar63 & 0xf8f00fff | uVar129 |
       ((src_params->shp_params).color_ctrl_p3_scaling_coef & 7U) << 0x18);
  uVar129 = (src_params->shp_params).color_ctrl_p3_roll_tab[0] & 0x1f;
  aVar45 = (ctx->reg).sharp.reg153;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)((uint)aVar45 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p3_roll_tab[1] & 0x1fU) << 5;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)((uint)aVar45 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p3_roll_tab[2] & 0x1fU) << 10;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar45 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  uVar146 = ((src_params->shp_params).color_ctrl_p3_roll_tab[3] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar45 & 0xfff00000 | uVar129 | uVar132 | uVar147 | uVar146);
  uVar128 = ((src_params->shp_params).color_ctrl_p3_roll_tab[4] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar45 & 0xfe000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128);
  (ctx->reg).sharp.reg153 =
       (anon_struct_4_6_f3352084_for_reg153)
       ((uint)aVar45 & 0xc0000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 |
       ((src_params->shp_params).color_ctrl_p3_roll_tab[5] & 0x1fU) << 0x19);
  uVar129 = (src_params->shp_params).color_ctrl_p3_roll_tab[6] & 0x1f;
  aVar46 = (ctx->reg).sharp.reg154;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)((uint)aVar46 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p3_roll_tab[7] & 0x1fU) << 5;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)((uint)aVar46 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p3_roll_tab[8] & 0x1fU) << 10;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar46 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  uVar146 = ((src_params->shp_params).color_ctrl_p3_roll_tab[9] & 0x1fU) << 0xf;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar46 & 0xfff00000 | uVar129 | uVar132 | uVar147 | uVar146);
  uVar128 = ((src_params->shp_params).color_ctrl_p3_roll_tab[10] & 0x1fU) << 0x14;
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar46 & 0xfe000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128);
  (ctx->reg).sharp.reg154 =
       (anon_struct_4_6_df9877e4_for_reg154)
       ((uint)aVar46 & 0xc0000000 | uVar129 | uVar132 | uVar147 | uVar146 | uVar128 |
       ((src_params->shp_params).color_ctrl_p3_roll_tab[0xb] & 0x1fU) << 0x19);
  uVar129 = (src_params->shp_params).color_ctrl_p3_roll_tab[0xc] & 0x1f;
  aVar47 = (ctx->reg).sharp.reg155;
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)((uint)aVar47 & 0xffffffe0 | uVar129);
  uVar132 = ((src_params->shp_params).color_ctrl_p3_roll_tab[0xd] & 0x1fU) << 5;
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)((uint)aVar47 & 0xfffffc00 | uVar129 | uVar132);
  uVar147 = ((src_params->shp_params).color_ctrl_p3_roll_tab[0xe] & 0x1fU) << 10;
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)
       ((uint)aVar47 & 0xffff8000 | uVar129 | uVar132 | uVar147);
  (ctx->reg).sharp.reg155 =
       (anon_struct_4_4_9cefec43_for_reg155)
       ((uint)aVar47 & 0xfff00000 | uVar129 | uVar132 | uVar147 |
       ((src_params->shp_params).color_ctrl_p3_roll_tab[0xf] & 0x1fU) << 0xf);
  aVar48 = (ctx->reg).sharp.reg156;
  uVar129 = (src_params->shp_params).tex_adj_mode_select & 1;
  (ctx->reg).sharp.reg156 =
       (anon_struct_4_6_adc393a5_for_reg156)((uint)aVar48 & 0xfffffffe | uVar129);
  aVar48 = (anon_struct_4_6_adc393a5_for_reg156)
           (((uint)aVar48 & 0xfffffff8 | uVar129) +
           ((src_params->shp_params).tex_adj_y_mode_select & 3U) * 2);
  (ctx->reg).sharp.reg156 = aVar48;
  uVar129 = (src_params->shp_params).tex_adj_grd[1];
  aVar48 = (anon_struct_4_6_adc393a5_for_reg156)
           (((uint)aVar48 & 0xfffff00f) + (uVar129 & 0x3fc) * 4);
  (ctx->reg).sharp.reg156 = aVar48;
  uVar132 = (src_params->shp_params).tex_adj_grd[2];
  (ctx->reg).sharp.reg156 =
       (anon_struct_4_6_adc393a5_for_reg156)((uint)aVar48 & 0xff00ffff | (uVar132 & 0x3fc) << 0xe);
  aVar49 = (ctx->reg).sharp.reg157;
  uVar146 = (uint)(src_params->shp_params).tex_adj_grd[3] >> 2 & 0xff;
  (ctx->reg).sharp.reg157 =
       (anon_struct_4_5_5dea9ddc_for_reg157)((uint)aVar49 & 0xffffff00 | uVar146);
  uVar147 = (src_params->shp_params).tex_adj_grd[4];
  uVar128 = (uVar147 & 0x3fc) << 10;
  (ctx->reg).sharp.reg157 =
       (anon_struct_4_5_5dea9ddc_for_reg157)((uint)aVar49 & 0xfff00f00 | uVar146 | uVar128);
  uVar138 = (src_params->shp_params).tex_adj_val[0] & 0x7f;
  (ctx->reg).sharp.reg157 =
       (anon_struct_4_5_5dea9ddc_for_reg157)
       ((uint)aVar49 & 0x80f00f00 | uVar146 | uVar128 | uVar138 << 0x18);
  aVar50 = (ctx->reg).sharp.reg158;
  uVar160 = (src_params->shp_params).tex_adj_val[1] & 0x7f;
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)((uint)aVar50 & 0xffffff80 | uVar160);
  uVar134 = (src_params->shp_params).tex_adj_val[2] & 0x7f;
  uVar128 = uVar134 << 8;
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)((uint)aVar50 & 0xffff8080 | uVar160 | uVar128);
  uVar161 = (src_params->shp_params).tex_adj_val[3] & 0x7f;
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)
       ((uint)aVar50 & 0xff808080 | uVar160 | uVar128 | uVar161 << 0x10);
  uVar159 = (src_params->shp_params).tex_adj_val[4] & 0x7f;
  uVar133 = uVar129 >> 2 & 0xff;
  iVar150 = uVar133 + (uVar133 == 0);
  uVar129 = uVar132 >> 2 & 0xff;
  uVar132 = uVar146 - uVar129;
  uVar129 = uVar129 - uVar133;
  uVar133 = 1;
  if ((int)uVar129 < 2) {
    uVar129 = uVar133;
  }
  (ctx->reg).sharp.reg158 =
       (anon_struct_4_7_e0b31a4c_for_reg158)
       ((uint)aVar50 & 0x80808080 | uVar160 | uVar128 | uVar161 << 0x10 | uVar159 << 0x18);
  if ((int)uVar132 < 2) {
    uVar132 = uVar133;
  }
  uVar147 = uVar147 >> 2 & 0xff;
  uVar146 = uVar147 - uVar146;
  if ((int)uVar146 < 2) {
    uVar146 = uVar133;
  }
  uVar147 = uVar147 ^ 0xff;
  fVar172 = ((float)(int)((src_params->shp_params).tex_adj_val[5] - uVar159) * 128.0) /
            (float)(uVar147 + (uVar147 == 0));
  if (fVar172 <= 0.0) {
    fVar169 = -0.5;
  }
  iVar162 = (int)(fVar169 + fVar172);
  fVar180 = (float)(int)(uVar160 - uVar138) * 128.0;
  fVar178 = (float)(int)(uVar161 - uVar134) * 128.0;
  auVar167._4_4_ = uVar132;
  auVar167._0_4_ = iVar150;
  auVar167._8_8_ = 0;
  auVar165._0_4_ = (float)iVar150;
  auVar165._4_4_ = (float)(int)uVar132;
  auVar165._8_8_ = 0;
  auVar176 = rcpps(auVar167,auVar165);
  fVar169 = fVar180 * auVar176._0_4_;
  fVar172 = fVar178 * auVar176._4_4_;
  fVar169 = (fVar180 - auVar165._0_4_ * fVar169) * auVar176._0_4_ + fVar169;
  fVar172 = (fVar178 - auVar165._4_4_ * fVar172) * auVar176._4_4_ + fVar172;
  uVar132 = -(uint)(0.0 < fVar169);
  uVar147 = -(uint)(0.0 < fVar172);
  auVar117._4_8_ = 0;
  auVar117._0_4_ = uVar132 & 0x3fe00000;
  auVar171._0_12_ = auVar117 << 0x20;
  auVar171._12_4_ = uVar147 & 0x3fe00000;
  auVar118._4_8_ = 0;
  auVar118._0_4_ = ~uVar132 & 0xbfe00000;
  auVar166._0_12_ = auVar118 << 0x20;
  auVar166._12_4_ = ~uVar147 & 0xbfe00000;
  fVar190 = (float)(int)(uVar134 - uVar160) * 128.0;
  fVar212 = (float)(int)(uVar159 - uVar161) * 128.0;
  auVar168._0_4_ = (float)(int)uVar129;
  auVar168._4_4_ = (float)(int)uVar146;
  auVar168._8_8_ = 0;
  auVar176 = rcpps(ZEXT416(uVar146),auVar168);
  fVar180 = fVar190 * auVar176._0_4_;
  fVar178 = fVar212 * auVar176._4_4_;
  fVar180 = (fVar190 - auVar168._0_4_ * fVar180) * auVar176._0_4_ + fVar180;
  fVar178 = (fVar212 - auVar168._4_4_ * fVar178) * auVar176._4_4_ + fVar178;
  uVar129 = -(uint)(0.0 < fVar180);
  uVar132 = -(uint)(0.0 < fVar178);
  auVar119._4_8_ = 0;
  auVar119._0_4_ = uVar129 & 0x3fe00000;
  auVar177._0_12_ = auVar119 << 0x20;
  auVar177._12_4_ = uVar132 & 0x3fe00000;
  auVar120._4_8_ = 0;
  auVar120._0_4_ = ~uVar129 & 0xbfe00000;
  auVar210._0_12_ = auVar120 << 0x20;
  auVar210._12_4_ = ~uVar132 & 0xbfe00000;
  uVar128 = (uint)(SUB168(auVar210 | auVar177,0) + (double)fVar180);
  uVar133 = (uint)(SUB168(auVar210 | auVar177,8) + (double)fVar178);
  uVar129 = (uint)(SUB168(auVar166 | auVar171,0) + (double)fVar169);
  uVar132 = (uint)(SUB168(auVar166 | auVar171,8) + (double)fVar172);
  uVar147 = -(uint)((int)uVar129 < 0x3ff);
  uVar146 = -(uint)((int)uVar132 < 0x3ff);
  uVar134 = ~uVar147 & 0x3ff | uVar129 & uVar147;
  uVar138 = ~uVar146 & 0x3ff | uVar132 & uVar146;
  uVar129 = -(uint)(-0x400 < (int)uVar134);
  uVar147 = -(uint)(-0x400 < (int)uVar138);
  aVar106 = (ctx->reg).sharp.reg160;
  uVar132 = -(uint)((int)uVar128 < 0x3ff);
  uVar146 = -(uint)((int)uVar133 < 0x3ff);
  uVar132 = ~uVar132 & 0x3ff | uVar128 & uVar132;
  uVar146 = ~uVar146 & 0x3ff | uVar133 & uVar146;
  uVar128 = -(uint)(-0x400 < (int)uVar132);
  uVar133 = -(uint)(-0x400 < (int)uVar146);
  (ctx->reg).sharp.reg159 =
       (anon_struct_4_3_fedd7f09_for_reg159)
       (((~uVar128 & 0xfffffc00 | uVar132 & uVar128) & 0x7ff) << 0xc |
       (uint)(ctx->reg).sharp.reg159 & 0xff800800 |
       (~uVar129 & 0xfffffc00 | uVar134 & uVar129) & 0x7ff);
  (ctx->reg).sharp.reg160 =
       (anon_struct_4_3_fedd8709_for_reg160)
       (((~uVar133 & 0xfffffc00 | uVar146 & uVar133) & 0x7ff) << 0xc |
       (uint)aVar106 & 0xff800800 | (~uVar147 & 0xfffffc00 | uVar138 & uVar147) & 0x7ff);
  iVar150 = 0x3ff;
  if (iVar162 < 0x3ff) {
    iVar150 = iVar162;
  }
  if (-0x400 < iVar150) {
    iVar144 = iVar150;
  }
  *(ushort *)&(ctx->reg).sharp.reg161 =
       *(ushort *)&(ctx->reg).sharp.reg161 & 0xf800 | (ushort)iVar144 & 0x7ff;
  RVar124 = src_params->dst_width;
  RVar125 = src_params->dst_height;
  RVar4 = src_params->src_height;
  (src_params->zme_params).src_width = src_params->src_width;
  (src_params->zme_params).src_height = RVar4;
  (src_params->zme_params).dst_width = RVar124;
  (src_params->zme_params).dst_height = RVar125;
  (src_params->zme_params).dst_fmt = src_params->dst_fmt;
  RVar4 = src_params->dst_c_width;
  (src_params->zme_params).yuv_out_diff = src_params->yuv_out_diff;
  (src_params->zme_params).dst_c_width = RVar4;
  (src_params->zme_params).dst_c_height = src_params->dst_c_height;
  set_zme_to_vdpp_reg(&src_params->zme_params,&ctx->zme);
  return extraout_EAX;
}

Assistant:

static MPP_RET vdpp2_params_to_reg(struct vdpp2_params* src_params, struct vdpp2_api_ctx *ctx)
{
    struct vdpp2_reg *dst_reg = &ctx->reg;
    struct zme_params *zme_params = &src_params->zme_params;

    memset(dst_reg, 0, sizeof(*dst_reg));

    dst_reg->common.reg0.sw_vdpp_frm_en = 1;

    /* 0x0004(reg1), TODO: add debug function */
    dst_reg->common.reg1.sw_vdpp_src_fmt = VDPP_FMT_YUV420;
    dst_reg->common.reg1.sw_vdpp_src_yuv_swap = src_params->src_yuv_swap;

    if (MPP_FMT_YUV420SP_VU == src_params->src_fmt)
        dst_reg->common.reg1.sw_vdpp_src_yuv_swap = 1;

    dst_reg->common.reg1.sw_vdpp_dst_fmt = src_params->dst_fmt;
    dst_reg->common.reg1.sw_vdpp_dst_yuv_swap = src_params->dst_yuv_swap;
    dst_reg->common.reg1.sw_vdpp_dbmsr_en = (src_params->working_mode == VDPP_WORK_MODE_DCI)
                                            ? 0
                                            : src_params->dmsr_params.dmsr_enable;

    /* 0x0008(reg2) */
    dst_reg->common.reg2.sw_vdpp_working_mode = src_params->working_mode;
    VDPP2_DBG(VDPP2_DBG_TRACE, "working_mode %d", src_params->working_mode);

    /* 0x000C ~ 0x001C(reg3 ~ reg7), skip */
    dst_reg->common.reg4.sw_vdpp_clk_on = 1;
    dst_reg->common.reg4.sw_md_clk_on = 1;
    dst_reg->common.reg4.sw_dect_clk_on = 1;
    dst_reg->common.reg4.sw_me_clk_on = 1;
    dst_reg->common.reg4.sw_mc_clk_on = 1;
    dst_reg->common.reg4.sw_eedi_clk_on = 1;
    dst_reg->common.reg4.sw_ble_clk_on = 1;
    dst_reg->common.reg4.sw_out_clk_on = 1;
    dst_reg->common.reg4.sw_ctrl_clk_on = 1;
    dst_reg->common.reg4.sw_ram_clk_on = 1;
    dst_reg->common.reg4.sw_dma_clk_on = 1;
    dst_reg->common.reg4.sw_reg_clk_on = 1;

    /* 0x0020(reg8) */
    dst_reg->common.reg8.sw_vdpp_frm_done_en = 1;
    dst_reg->common.reg8.sw_vdpp_osd_max_en = 1;
    dst_reg->common.reg8.sw_vdpp_bus_error_en = 1;
    dst_reg->common.reg8.sw_vdpp_timeout_int_en = 1;
    dst_reg->common.reg8.sw_vdpp_config_error_en = 1;
    /* 0x0024 ~ 0x002C(reg9 ~ reg11), skip */
    {
        RK_U32 src_right_redundant = src_params->src_width % 16 == 0 ? 0 : 16 - src_params->src_width % 16;
        RK_U32 src_down_redundant  = src_params->src_height % 8 == 0 ? 0 : 8 - src_params->src_height % 8;
        RK_U32 dst_right_redundant = src_params->dst_width % 16 == 0 ? 0 : 16 - src_params->dst_width % 16;
        /* 0x0030(reg12) */
        dst_reg->common.reg12.sw_vdpp_src_vir_y_stride = src_params->src_width_vir / 4;

        /* 0x0034(reg13) */
        dst_reg->common.reg13.sw_vdpp_dst_vir_y_stride = src_params->dst_width_vir / 4;

        /* 0x0038(reg14) */
        dst_reg->common.reg14.sw_vdpp_src_pic_width = src_params->src_width + src_right_redundant - 1;
        dst_reg->common.reg14.sw_vdpp_src_right_redundant = src_right_redundant;
        dst_reg->common.reg14.sw_vdpp_src_pic_height = src_params->src_height + src_down_redundant - 1;
        dst_reg->common.reg14.sw_vdpp_src_down_redundant = src_down_redundant;

        /* 0x003C(reg15) */
        dst_reg->common.reg15.sw_vdpp_dst_pic_width = src_params->dst_width + dst_right_redundant - 1;
        dst_reg->common.reg15.sw_vdpp_dst_right_redundant = dst_right_redundant;
        dst_reg->common.reg15.sw_vdpp_dst_pic_height = src_params->dst_height - 1;
    }
    /* 0x0040 ~ 0x005C(reg16 ~ reg23), skip */
    dst_reg->common.reg20.sw_vdpp_timeout_en = 1;
    dst_reg->common.reg20.sw_vdpp_timeout_cnt = 0x8FFFFFF;

    /* 0x0060(reg24) */
    dst_reg->common.reg24.sw_vdpp_src_addr_y = src_params->src.y;

    /* 0x0064(reg25) */
    dst_reg->common.reg25.sw_vdpp_src_addr_uv = src_params->src.cbcr;

    /* 0x0068(reg26) */
    dst_reg->common.reg26.sw_vdpp_dst_addr_y = src_params->dst.y;

    /* 0x006C(reg27) */
    dst_reg->common.reg27.sw_vdpp_dst_addr_uv = src_params->dst.cbcr;

    if (src_params->yuv_out_diff) {
        RK_U32 dst_right_redundant_c = src_params->dst_c_width % 16 == 0 ? 0 : 16 - src_params->dst_c_width % 16;

        dst_reg->common.reg1.sw_vdpp_yuvout_diff_en = src_params->yuv_out_diff;
        dst_reg->common.reg13.sw_vdpp_dst_vir_c_stride = src_params->dst_c_width_vir / 4;
        /* 0x0040(reg16) */
        dst_reg->common.reg16.sw_vdpp_dst_pic_width_c = src_params->dst_c_width + dst_right_redundant_c - 1;
        dst_reg->common.reg16.sw_vdpp_dst_right_redundant_c = dst_right_redundant_c;
        dst_reg->common.reg16.sw_vdpp_dst_pic_height_c = src_params->dst_c_height - 1;

        dst_reg->common.reg27.sw_vdpp_dst_addr_uv = src_params->dst_c.cbcr;
    }

    set_dmsr_to_vdpp_reg(&src_params->dmsr_params, &ctx->dmsr);
    set_hist_to_vdpp2_reg(src_params, dst_reg);
    set_es_to_vdpp2_reg(src_params, dst_reg);
    set_shp_to_vdpp2_reg(src_params, dst_reg);

    zme_params->src_width = src_params->src_width;
    zme_params->src_height = src_params->src_height;
    zme_params->dst_width = src_params->dst_width;
    zme_params->dst_height = src_params->dst_height;
    zme_params->dst_fmt = src_params->dst_fmt;
    zme_params->yuv_out_diff = src_params->yuv_out_diff;
    zme_params->dst_c_width = src_params->dst_c_width;
    zme_params->dst_c_height = src_params->dst_c_height;
    set_zme_to_vdpp_reg(zme_params, &ctx->zme);

    return MPP_OK;
}